

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::SubGridIntersector1Pluecker<4,_true>_>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 uVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  ushort uVar8;
  ushort uVar9;
  ulong uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  RTCIntersectArguments *pRVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar27;
  undefined4 uVar28;
  undefined1 (*pauVar29) [16];
  long lVar30;
  Scene *pSVar31;
  undefined8 uVar32;
  RayHit *pRVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  RTCRayQueryContext *pRVar47;
  ulong uVar48;
  byte bVar49;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar82;
  float fVar100;
  float fVar101;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar102;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar115;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar135;
  float fVar136;
  float fVar143;
  uint uVar144;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar145;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar153;
  float fVar154;
  float fVar158;
  float fVar159;
  undefined1 auVar155 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar167 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar198;
  float fVar201;
  float fVar202;
  float fVar205;
  float fVar206;
  undefined1 auVar196 [16];
  float fVar199;
  float fVar200;
  float fVar203;
  float fVar204;
  float fVar207;
  float fVar208;
  undefined1 auVar197 [16];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_14d1;
  RayQueryContext *local_14d0;
  undefined1 local_14c4 [12];
  undefined1 local_14b8 [8];
  float fStack_14b0;
  float fStack_14ac;
  ulong local_14a0;
  undefined1 local_1498 [4];
  undefined1 auStack_1494 [8];
  float fStack_148c;
  float local_1488;
  float fStack_1484;
  float fStack_1480;
  float fStack_147c;
  uint local_1478 [1];
  uint auStack_1474 [1];
  float fStack_1470;
  float fStack_146c;
  ulong local_1460;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  undefined1 local_1448 [16];
  ulong local_1430;
  RTCFilterFunctionNArguments local_1428;
  undefined1 local_13f8 [16];
  undefined8 local_13e8;
  float fStack_13e0;
  float fStack_13dc;
  undefined8 local_13d8;
  float fStack_13d0;
  float fStack_13cc;
  undefined8 local_13c8;
  float fStack_13c0;
  float fStack_13bc;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float local_13a8;
  undefined4 local_13a4;
  undefined4 local_13a0;
  undefined4 local_139c;
  undefined4 local_1398;
  undefined4 local_1394;
  undefined4 local_1390;
  uint local_138c;
  uint local_1388;
  undefined1 (*local_1370) [16];
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  undefined1 local_1348 [8];
  float fStack_1340;
  float fStack_133c;
  undefined1 local_1338 [8];
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  undefined1 local_12f8 [8];
  float fStack_12f0;
  float fStack_12ec;
  undefined1 local_12e8 [8];
  float fStack_12e0;
  float fStack_12dc;
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  undefined1 *local_12c8;
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  ulong local_1238;
  ulong local_1230;
  ulong local_1228;
  ulong local_1220;
  ulong local_1218;
  ulong local_1210;
  long local_1208;
  long local_1200;
  ulong local_11f8;
  ulong local_11f0;
  ulong local_11e8;
  long local_11e0;
  ulong local_11d8;
  ulong local_11d0;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined1 local_11b8 [16];
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  uint local_1198;
  uint uStack_1194;
  uint uStack_1190;
  uint uStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined8 local_10a8;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined8 local_1078;
  float fStack_1070;
  float fStack_106c;
  undefined8 local_1068;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_1370 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar154 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar185 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar115 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar82 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar7 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar136 = 0.0;
    if (0.0 <= fVar82) {
      fVar136 = fVar82;
    }
    fVar82 = (ray->super_RayK<1>).tfar;
    fVar100 = 0.0;
    if (0.0 <= fVar82) {
      fVar100 = fVar82;
    }
    auVar50._4_4_ = -(uint)(ABS(aVar7.y) < 1e-18);
    auVar50._0_4_ = -(uint)(ABS(aVar7.x) < 1e-18);
    auVar50._8_4_ = -(uint)(ABS(aVar7.z) < 1e-18);
    auVar50._12_4_ = -(uint)(ABS(aVar7.field_3.w) < 1e-18);
    auVar155 = divps(_DAT_01f7ba10,(undefined1  [16])aVar7);
    auVar155 = blendvps(auVar155,_DAT_01fab950,auVar50);
    fVar164 = auVar155._0_4_ * 0.99999964;
    fVar168 = auVar155._4_4_ * 0.99999964;
    fVar171 = auVar155._8_4_ * 0.99999964;
    fVar153 = auVar155._0_4_ * 1.0000004;
    fVar158 = auVar155._4_4_ * 1.0000004;
    fVar159 = auVar155._8_4_ * 1.0000004;
    uVar42 = (ulong)(fVar164 < 0.0) << 4;
    uVar37 = (ulong)(fVar168 < 0.0) << 4 | 0x20;
    uVar43 = (ulong)(fVar171 < 0.0) << 4 | 0x40;
    uVar39 = uVar42 ^ 0x10;
    uVar46 = uVar37 ^ 0x10;
    auVar155._4_4_ = fVar136;
    auVar155._0_4_ = fVar136;
    auVar155._8_4_ = fVar136;
    auVar155._12_4_ = fVar136;
    auVar125._4_4_ = fVar100;
    auVar125._0_4_ = fVar100;
    auVar125._8_4_ = fVar100;
    auVar125._12_4_ = fVar100;
    local_1210 = (ulong)(((uint)(fVar164 < 0.0) << 4) >> 2);
    local_1218 = uVar39 >> 2;
    local_1220 = uVar37 >> 2;
    local_1228 = uVar46 >> 2;
    local_1230 = uVar43 >> 2;
    local_11d0 = uVar43 ^ 0x10;
    local_1238 = (uVar43 ^ 0x10) >> 2;
    _local_1198 = mm_lookupmask_ps._240_8_;
    _uStack_1190 = mm_lookupmask_ps._248_8_;
    local_1248 = fVar115;
    fStack_1244 = fVar115;
    fStack_1240 = fVar115;
    fStack_123c = fVar115;
    local_10b8 = fVar159;
    fStack_10b4 = fVar159;
    fStack_10b0 = fVar159;
    fStack_10ac = fVar159;
    local_1430 = uVar39;
    local_11b8 = auVar155;
    local_10c8 = fVar171;
    fStack_10c4 = fVar171;
    fStack_10c0 = fVar171;
    fStack_10bc = fVar171;
    local_10d8 = fVar154;
    fStack_10d4 = fVar154;
    fStack_10d0 = fVar154;
    fStack_10cc = fVar154;
    local_10e8 = fVar185;
    fStack_10e4 = fVar185;
    fStack_10e0 = fVar185;
    fStack_10dc = fVar185;
    local_11e8 = uVar42;
    local_11c8 = fVar164;
    fStack_11c4 = fVar164;
    fStack_11c0 = fVar164;
    fStack_11bc = fVar164;
    local_10f8 = fVar168;
    fStack_10f4 = fVar168;
    fStack_10f0 = fVar168;
    fStack_10ec = fVar168;
    local_1108 = fVar153;
    fStack_1104 = fVar153;
    fStack_1100 = fVar153;
    fStack_10fc = fVar153;
    local_11a8 = fVar158;
    fStack_11a4 = fVar158;
    fStack_11a0 = fVar158;
    fStack_119c = fVar158;
    local_11f0 = uVar37;
    local_11f8 = uVar43;
    local_14a0 = uVar46;
    fVar162 = fVar185;
    fVar135 = fVar185;
    fVar143 = fVar185;
    fVar145 = fVar153;
    fVar165 = fVar153;
    fVar169 = fVar153;
    fVar136 = fVar115;
    fVar82 = fVar115;
    fVar100 = fVar115;
    fVar172 = fVar164;
    fVar175 = fVar164;
    fVar183 = fVar164;
    fVar187 = fVar159;
    fVar189 = fVar159;
    fVar193 = fVar159;
    fVar202 = fVar171;
    fVar206 = fVar171;
    fVar174 = fVar171;
    fVar180 = fVar154;
    fVar181 = fVar154;
    fVar182 = fVar154;
    fVar101 = fVar158;
    fVar160 = fVar158;
    fVar102 = fVar158;
    fVar198 = fVar168;
    fVar201 = fVar168;
    fVar205 = fVar168;
    local_14d0 = context;
LAB_00db2a07:
    do {
      pauVar29 = local_1370 + -1;
      pfVar5 = &(ray->super_RayK<1>).tfar;
      if (*pfVar5 <= *(float *)((long)local_1370[-1] + 8) &&
          *(float *)((long)local_1370[-1] + 8) != *pfVar5) {
        local_1370 = pauVar29;
      }
      else {
        local_1370 = pauVar29;
        uVar48 = *(ulong *)*pauVar29;
        while ((uVar48 & 8) == 0) {
          pfVar5 = (float *)(uVar48 + 0x20 + uVar42);
          auVar83._0_4_ = (*pfVar5 - fVar154) * fVar164;
          auVar83._4_4_ = (pfVar5[1] - fVar180) * fVar172;
          auVar83._8_4_ = (pfVar5[2] - fVar181) * fVar175;
          auVar83._12_4_ = (pfVar5[3] - fVar182) * fVar183;
          pfVar5 = (float *)(uVar48 + 0x20 + uVar37);
          auVar133._0_4_ = (*pfVar5 - fVar185) * fVar168;
          auVar133._4_4_ = (pfVar5[1] - fVar162) * fVar198;
          auVar133._8_4_ = (pfVar5[2] - fVar135) * fVar201;
          auVar133._12_4_ = (pfVar5[3] - fVar143) * fVar205;
          auVar50 = maxps(auVar83,auVar133);
          pfVar5 = (float *)(uVar48 + 0x20 + uVar43);
          auVar139._0_4_ = (*pfVar5 - fVar115) * fVar171;
          auVar139._4_4_ = (pfVar5[1] - fVar136) * fVar202;
          auVar139._8_4_ = (pfVar5[2] - fVar82) * fVar206;
          auVar139._12_4_ = (pfVar5[3] - fVar100) * fVar174;
          pfVar5 = (float *)(uVar48 + 0x20 + uVar39);
          auVar103._0_4_ = (*pfVar5 - fVar154) * fVar153;
          auVar103._4_4_ = (pfVar5[1] - fVar180) * fVar145;
          auVar103._8_4_ = (pfVar5[2] - fVar181) * fVar165;
          auVar103._12_4_ = (pfVar5[3] - fVar182) * fVar169;
          pfVar5 = (float *)(uVar48 + 0x20 + uVar46);
          auVar116._0_4_ = (*pfVar5 - fVar185) * fVar158;
          auVar116._4_4_ = (pfVar5[1] - fVar162) * fVar101;
          auVar116._8_4_ = (pfVar5[2] - fVar135) * fVar160;
          auVar116._12_4_ = (pfVar5[3] - fVar143) * fVar102;
          auVar104 = minps(auVar103,auVar116);
          pfVar5 = (float *)(uVar48 + 0x20 + local_11d0);
          auVar117._0_4_ = (*pfVar5 - fVar115) * fVar159;
          auVar117._4_4_ = (pfVar5[1] - fVar136) * fVar187;
          auVar117._8_4_ = (pfVar5[2] - fVar82) * fVar189;
          auVar117._12_4_ = (pfVar5[3] - fVar100) * fVar193;
          auVar83 = maxps(auVar139,auVar155);
          _local_12f8 = maxps(auVar50,auVar83);
          auVar50 = minps(auVar117,auVar125);
          auVar50 = minps(auVar104,auVar50);
          auVar104._4_4_ = -(uint)(local_12f8._4_4_ <= auVar50._4_4_);
          auVar104._0_4_ = -(uint)(local_12f8._0_4_ <= auVar50._0_4_);
          auVar104._8_4_ = -(uint)(local_12f8._8_4_ <= auVar50._8_4_);
          auVar104._12_4_ = -(uint)(local_12f8._12_4_ <= auVar50._12_4_);
          uVar40 = movmskps((int)local_11d0,auVar104);
          if (uVar40 == 0) {
            if (local_1370 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00db2a07;
          }
          uVar40 = uVar40 & 0xff;
          uVar35 = uVar48 & 0xfffffffffffffff0;
          lVar30 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar35 + lVar30 * 8);
          uVar40 = uVar40 - 1 & uVar40;
          uVar48 = uVar10;
          if (uVar40 != 0) {
            uVar144 = *(uint *)(local_12f8 + lVar30 * 4);
            lVar30 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            uVar48 = *(ulong *)(uVar35 + lVar30 * 8);
            uVar27 = *(uint *)(local_12f8 + lVar30 * 4);
            uVar40 = uVar40 - 1 & uVar40;
            if (uVar40 == 0) {
              if (uVar144 < uVar27) {
                *(ulong *)*local_1370 = uVar48;
                *(uint *)((long)*local_1370 + 8) = uVar27;
                local_1370 = local_1370 + 1;
                uVar48 = uVar10;
              }
              else {
                *(ulong *)*local_1370 = uVar10;
                *(uint *)((long)*local_1370 + 8) = uVar144;
                local_1370 = local_1370 + 1;
              }
            }
            else {
              auVar84._8_4_ = uVar144;
              auVar84._0_8_ = uVar10;
              auVar84._12_4_ = 0;
              auVar118._8_4_ = uVar27;
              auVar118._0_8_ = uVar48;
              auVar118._12_4_ = 0;
              lVar30 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              uVar32 = *(undefined8 *)(uVar35 + lVar30 * 8);
              iVar41 = *(int *)(local_12f8 + lVar30 * 4);
              auVar105._8_4_ = iVar41;
              auVar105._0_8_ = uVar32;
              auVar105._12_4_ = 0;
              auVar51._8_4_ = -(uint)((int)uVar144 < (int)uVar27);
              uVar40 = uVar40 - 1 & uVar40;
              if (uVar40 == 0) {
                auVar51._4_4_ = auVar51._8_4_;
                auVar51._0_4_ = auVar51._8_4_;
                auVar51._12_4_ = auVar51._8_4_;
                auVar131._8_4_ = uVar27;
                auVar131._0_8_ = uVar48;
                auVar131._12_4_ = 0;
                auVar83 = blendvps(auVar131,auVar84,auVar51);
                auVar50 = blendvps(auVar84,auVar118,auVar51);
                auVar52._8_4_ = -(uint)(auVar83._8_4_ < iVar41);
                auVar52._4_4_ = auVar52._8_4_;
                auVar52._0_4_ = auVar52._8_4_;
                auVar52._12_4_ = auVar52._8_4_;
                auVar119._8_4_ = iVar41;
                auVar119._0_8_ = uVar32;
                auVar119._12_4_ = 0;
                auVar104 = blendvps(auVar119,auVar83,auVar52);
                auVar133 = blendvps(auVar83,auVar105,auVar52);
                auVar53._8_4_ = -(uint)(auVar50._8_4_ < auVar133._8_4_);
                auVar53._4_4_ = auVar53._8_4_;
                auVar53._0_4_ = auVar53._8_4_;
                auVar53._12_4_ = auVar53._8_4_;
                auVar83 = blendvps(auVar133,auVar50,auVar53);
                auVar50 = blendvps(auVar50,auVar133,auVar53);
                *local_1370 = auVar50;
                local_1370[1] = auVar83;
                local_1370 = local_1370 + 2;
                uVar48 = auVar104._0_8_;
              }
              else {
                lVar30 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                auVar54._4_4_ = auVar51._8_4_;
                auVar54._0_4_ = auVar51._8_4_;
                auVar54._8_4_ = auVar51._8_4_;
                auVar54._12_4_ = auVar51._8_4_;
                auVar133 = blendvps(auVar118,auVar84,auVar54);
                auVar50 = blendvps(auVar84,auVar118,auVar54);
                auVar137._8_4_ = *(int *)(local_12f8 + lVar30 * 4);
                auVar137._0_8_ = *(undefined8 *)(uVar35 + lVar30 * 8);
                auVar137._12_4_ = 0;
                auVar55._8_4_ = -(uint)(iVar41 < *(int *)(local_12f8 + lVar30 * 4));
                auVar55._4_4_ = auVar55._8_4_;
                auVar55._0_4_ = auVar55._8_4_;
                auVar55._12_4_ = auVar55._8_4_;
                auVar104 = blendvps(auVar137,auVar105,auVar55);
                auVar83 = blendvps(auVar105,auVar137,auVar55);
                auVar56._8_4_ = -(uint)(auVar50._8_4_ < auVar83._8_4_);
                auVar56._4_4_ = auVar56._8_4_;
                auVar56._0_4_ = auVar56._8_4_;
                auVar56._12_4_ = auVar56._8_4_;
                auVar139 = blendvps(auVar83,auVar50,auVar56);
                auVar50 = blendvps(auVar50,auVar83,auVar56);
                auVar57._8_4_ = -(uint)(auVar133._8_4_ < auVar104._8_4_);
                auVar57._4_4_ = auVar57._8_4_;
                auVar57._0_4_ = auVar57._8_4_;
                auVar57._12_4_ = auVar57._8_4_;
                auVar83 = blendvps(auVar104,auVar133,auVar57);
                auVar133 = blendvps(auVar133,auVar104,auVar57);
                auVar58._8_4_ = -(uint)(auVar133._8_4_ < auVar139._8_4_);
                auVar58._4_4_ = auVar58._8_4_;
                auVar58._0_4_ = auVar58._8_4_;
                auVar58._12_4_ = auVar58._8_4_;
                auVar104 = blendvps(auVar139,auVar133,auVar58);
                auVar133 = blendvps(auVar133,auVar139,auVar58);
                *local_1370 = auVar50;
                local_1370[1] = auVar133;
                local_1370[2] = auVar104;
                local_1370 = local_1370 + 3;
                uVar48 = auVar83._0_8_;
                fVar115 = local_1248;
                fVar136 = fStack_1244;
                fVar82 = fStack_1240;
                fVar100 = fStack_123c;
                fVar158 = local_11a8;
                fVar101 = fStack_11a4;
                fVar160 = fStack_11a0;
                fVar102 = fStack_119c;
              }
            }
          }
        }
        local_1208 = (ulong)((uint)uVar48 & 0xf) - 8;
        if (local_1208 != 0) {
          uVar48 = uVar48 & 0xfffffffffffffff0;
          local_1200 = 0;
          local_1058 = auVar125;
          do {
            lVar30 = local_1200 * 0x58;
            local_11e0 = uVar48 + lVar30;
            uVar32 = *(undefined8 *)(uVar48 + 0x20 + lVar30);
            uVar6 = *(undefined8 *)(uVar48 + 0x24 + lVar30);
            bVar14 = (byte)uVar32;
            bVar49 = (byte)uVar6;
            bVar15 = (byte)((ulong)uVar32 >> 8);
            bVar76 = (byte)((ulong)uVar6 >> 8);
            bVar16 = (byte)((ulong)uVar32 >> 0x10);
            bVar77 = (byte)((ulong)uVar6 >> 0x10);
            bVar17 = (byte)((ulong)uVar32 >> 0x18);
            bVar78 = (byte)((ulong)uVar6 >> 0x18);
            bVar18 = (byte)((ulong)uVar32 >> 0x20);
            bVar79 = (byte)((ulong)uVar6 >> 0x20);
            bVar19 = (byte)((ulong)uVar32 >> 0x28);
            bVar80 = (byte)((ulong)uVar6 >> 0x28);
            bVar20 = (byte)((ulong)uVar32 >> 0x30);
            bVar81 = (byte)((ulong)uVar6 >> 0x30);
            bVar24 = (byte)((ulong)uVar6 >> 0x38);
            bVar21 = (byte)((ulong)uVar32 >> 0x38);
            auVar59[0] = -((byte)((bVar14 < bVar49) * bVar14 | (bVar14 >= bVar49) * bVar49) ==
                          bVar14);
            auVar59[1] = -((byte)((bVar15 < bVar76) * bVar15 | (bVar15 >= bVar76) * bVar76) ==
                          bVar15);
            auVar59[2] = -((byte)((bVar16 < bVar77) * bVar16 | (bVar16 >= bVar77) * bVar77) ==
                          bVar16);
            auVar59[3] = -((byte)((bVar17 < bVar78) * bVar17 | (bVar17 >= bVar78) * bVar78) ==
                          bVar17);
            auVar59[4] = -((byte)((bVar18 < bVar79) * bVar18 | (bVar18 >= bVar79) * bVar79) ==
                          bVar18);
            auVar59[5] = -((byte)((bVar19 < bVar80) * bVar19 | (bVar19 >= bVar80) * bVar80) ==
                          bVar19);
            auVar59[6] = -((byte)((bVar20 < bVar81) * bVar20 | (bVar20 >= bVar81) * bVar81) ==
                          bVar20);
            auVar59[7] = -((byte)((bVar21 < bVar24) * bVar21 | (bVar21 >= bVar24) * bVar24) ==
                          bVar21);
            auVar59[8] = 0xff;
            auVar59[9] = 0xff;
            auVar59[10] = 0xff;
            auVar59[0xb] = 0xff;
            auVar59[0xc] = 0xff;
            auVar59[0xd] = 0xff;
            auVar59[0xe] = 0xff;
            auVar59[0xf] = 0xff;
            fVar136 = *(float *)(uVar48 + 0x38 + lVar30);
            fVar115 = *(float *)(uVar48 + 0x3c + lVar30);
            fVar82 = *(float *)(uVar48 + 0x44 + lVar30);
            auVar85._8_8_ = 0;
            auVar85._0_8_ = *(ulong *)(local_1210 + 0x20 + local_11e0);
            auVar155 = pmovzxbd(auVar85,auVar85);
            auVar106._8_8_ = 0;
            auVar106._0_8_ = *(ulong *)(local_1218 + 0x20 + local_11e0);
            auVar50 = pmovzxbd(auVar106,auVar106);
            fVar100 = *(float *)(uVar48 + 0x48 + lVar30);
            auVar120._8_8_ = 0;
            auVar120._0_8_ = *(ulong *)(local_1220 + 0x20 + local_11e0);
            auVar83 = pmovzxbd(auVar120,auVar120);
            auVar121._8_8_ = 0;
            auVar121._0_8_ = *(ulong *)(local_1228 + 0x20 + local_11e0);
            auVar104 = pmovzxbd(auVar121,auVar121);
            fVar172 = *(float *)(uVar48 + 0x4c + lVar30);
            auVar132._8_8_ = 0;
            auVar132._0_8_ = *(ulong *)(local_1230 + 0x20 + local_11e0);
            auVar133 = pmovzxbd(auVar132,auVar132);
            auVar138._8_8_ = 0;
            auVar138._0_8_ = *(ulong *)(local_1238 + 0x20 + local_11e0);
            auVar139 = pmovzxbd(auVar138,auVar138);
            fVar175 = *(float *)(uVar48 + 0x40 + lVar30);
            auVar86._0_4_ = (((float)auVar155._0_4_ * fVar82 + fVar136) - fVar154) * local_11c8;
            auVar86._4_4_ = (((float)auVar155._4_4_ * fVar82 + fVar136) - fVar180) * fStack_11c4;
            auVar86._8_4_ = (((float)auVar155._8_4_ * fVar82 + fVar136) - fVar181) * fStack_11c0;
            auVar86._12_4_ = (((float)auVar155._12_4_ * fVar82 + fVar136) - fVar182) * fStack_11bc;
            auVar146._0_4_ = (((float)auVar83._0_4_ * fVar100 + fVar115) - fVar185) * fVar168;
            auVar146._4_4_ = (((float)auVar83._4_4_ * fVar100 + fVar115) - fVar162) * fVar198;
            auVar146._8_4_ = (((float)auVar83._8_4_ * fVar100 + fVar115) - fVar135) * fVar201;
            auVar146._12_4_ = (((float)auVar83._12_4_ * fVar100 + fVar115) - fVar143) * fVar205;
            auVar155 = maxps(auVar86,auVar146);
            auVar107._0_4_ = (((float)auVar50._0_4_ * fVar82 + fVar136) - fVar154) * fVar153;
            auVar107._4_4_ = (((float)auVar50._4_4_ * fVar82 + fVar136) - fVar180) * fVar145;
            auVar107._8_4_ = (((float)auVar50._8_4_ * fVar82 + fVar136) - fVar181) * fVar165;
            auVar107._12_4_ = (((float)auVar50._12_4_ * fVar82 + fVar136) - fVar182) * fVar169;
            auVar122._0_4_ = (((float)auVar104._0_4_ * fVar100 + fVar115) - fVar185) * fVar158;
            auVar122._4_4_ = (((float)auVar104._4_4_ * fVar100 + fVar115) - fVar162) * fVar101;
            auVar122._8_4_ = (((float)auVar104._8_4_ * fVar100 + fVar115) - fVar135) * fVar160;
            auVar122._12_4_ = (((float)auVar104._12_4_ * fVar100 + fVar115) - fVar143) * fVar102;
            auVar50 = minps(auVar107,auVar122);
            auVar134._0_4_ = (((float)auVar133._0_4_ * fVar172 + fVar175) - local_1248) * fVar171;
            auVar134._4_4_ = (((float)auVar133._4_4_ * fVar172 + fVar175) - fStack_1244) * fVar202;
            auVar134._8_4_ = (((float)auVar133._8_4_ * fVar172 + fVar175) - fStack_1240) * fVar206;
            auVar134._12_4_ = (((float)auVar133._12_4_ * fVar172 + fVar175) - fStack_123c) * fVar174
            ;
            auVar83 = maxps(auVar134,local_11b8);
            local_f88 = maxps(auVar155,auVar83);
            auVar140._0_4_ = (((float)auVar139._0_4_ * fVar172 + fVar175) - local_1248) * fVar159;
            auVar140._4_4_ = (((float)auVar139._4_4_ * fVar172 + fVar175) - fStack_1244) * fVar187;
            auVar140._8_4_ = (((float)auVar139._8_4_ * fVar172 + fVar175) - fStack_1240) * fVar189;
            auVar140._12_4_ = (((float)auVar139._12_4_ * fVar172 + fVar175) - fStack_123c) * fVar193
            ;
            auVar155 = minps(auVar140,auVar125);
            auVar155 = minps(auVar50,auVar155);
            auVar60._4_4_ = -(uint)(local_f88._4_4_ <= auVar155._4_4_);
            auVar60._0_4_ = -(uint)(local_f88._0_4_ <= auVar155._0_4_);
            auVar60._8_4_ = -(uint)(local_f88._8_4_ <= auVar155._8_4_);
            auVar60._12_4_ = -(uint)(local_f88._12_4_ <= auVar155._12_4_);
            auVar155 = pmovzxbd(auVar59 ^ _DAT_01f7ae20,auVar59 ^ _DAT_01f7ae20);
            auVar60 = ~auVar155 & auVar60;
            auVar61._0_4_ = auVar60._0_4_ << 0x1f;
            auVar61._4_4_ = auVar60._4_4_ << 0x1f;
            auVar61._8_4_ = auVar60._8_4_ << 0x1f;
            auVar61._12_4_ = auVar60._12_4_ << 0x1f;
            uVar40 = movmskps((int)lVar30,auVar61);
            if (uVar40 != 0) {
              local_11d8 = (ulong)(uVar40 & 0xff);
              do {
                auVar155 = _local_1338;
                lVar30 = 0;
                if (local_11d8 != 0) {
                  for (; (local_11d8 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                fVar136 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_f88 + lVar30 * 4) <= fVar136) {
                  local_f98 = ZEXT416((uint)fVar136);
                  uVar8 = *(ushort *)(local_11e0 + lVar30 * 8);
                  uVar9 = *(ushort *)(local_11e0 + 2 + lVar30 * 8);
                  uVar40 = *(uint *)(local_11e0 + 0x50);
                  local_14c4._4_8_ = ZEXT48(uVar40);
                  uVar144 = *(uint *)(local_11e0 + 4 + lVar30 * 8);
                  pSVar31 = context->scene;
                  pGVar11 = (pSVar31->geometries).items[local_14c4._4_8_].ptr;
                  local_13e8 = *(long *)&pGVar11->field_0x58;
                  lVar30 = *(long *)&pGVar11[1].time_range.upper;
                  local_1460 = (ulong)uVar144;
                  lVar44 = (ulong)uVar144 *
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
                  uVar34 = uVar8 & 0x7fff;
                  uVar36 = uVar9 & 0x7fff;
                  local_13f8._0_8_ = lVar44;
                  uVar27 = *(uint *)(local_13e8 + 4 + lVar44);
                  uVar42 = (ulong)uVar27;
                  uVar43 = (ulong)(uVar27 * uVar36 + *(int *)(local_13e8 + lVar44) + uVar34);
                  p_Var12 = pGVar11[1].intersectionFilterN;
                  pfVar5 = (float *)(lVar30 + (long)p_Var12 * uVar43);
                  pfVar1 = (float *)(lVar30 + (uVar43 + 1) * (long)p_Var12);
                  local_1338._0_4_ = *pfVar1;
                  local_1088 = pfVar1[1];
                  local_1178 = pfVar1[2];
                  pfVar1 = (float *)(lVar30 + (uVar42 + uVar43) * (long)p_Var12);
                  local_1348._0_4_ = *pfVar1;
                  fVar154 = pfVar1[2];
                  lVar38 = uVar42 + uVar43 + 1;
                  pfVar2 = (float *)(lVar30 + lVar38 * (long)p_Var12);
                  local_13c8._0_4_ = *pfVar2;
                  local_13b8 = pfVar2[1];
                  local_13d8._0_4_ = pfVar2[2];
                  uVar37 = (ulong)(-1 < (short)uVar8);
                  pfVar2 = (float *)(lVar30 + (uVar37 + uVar43 + 1) * (long)p_Var12);
                  lVar45 = uVar37 + lVar38;
                  uVar37 = 0;
                  if (-1 < (short)uVar9) {
                    uVar37 = uVar42;
                  }
                  pfVar3 = (float *)(lVar30 + lVar45 * (long)p_Var12);
                  local_13c8._4_4_ = *pfVar3;
                  fStack_13b4 = pfVar3[1];
                  local_13d8._4_4_ = pfVar3[2];
                  pfVar3 = (float *)(lVar30 + (uVar42 + uVar43 + uVar37) * (long)p_Var12);
                  pfVar4 = (float *)(lVar30 + (lVar38 + uVar37) * (long)p_Var12);
                  fStack_13ac = pfVar4[1];
                  fStack_13b0 = *(float *)(lVar30 + (uVar37 + lVar45) * (long)p_Var12 + 4);
                  local_1338._4_4_ = *pfVar2;
                  _fStack_1330 = auVar155._8_8_;
                  auVar125 = _local_1338;
                  local_13d8 = CONCAT44(local_13d8._4_4_,(float)local_13d8);
                  local_13c8 = CONCAT44(local_13c8._4_4_,(float)local_13c8);
                  local_1488 = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar185 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar115 = (ray->super_RayK<1>).org.field_0.m128[2];
                  local_fb8 = pfVar5[1] - fVar185;
                  fStack_fb4 = local_1088 - fVar185;
                  fStack_fb0 = local_13b8 - fVar185;
                  fStack_fac = pfVar1[1] - fVar185;
                  local_fa8 = pfVar5[2] - fVar115;
                  fStack_fa4 = local_1178 - fVar115;
                  fStack_fa0 = (float)local_13d8 - fVar115;
                  fStack_f9c = fVar154 - fVar115;
                  fStack_1090 = fStack_13ac;
                  fStack_108c = pfVar3[1];
                  fVar135 = pfVar1[1] - fVar185;
                  fVar143 = local_13b8 - fVar185;
                  fVar153 = fStack_13ac - fVar185;
                  fVar145 = pfVar3[1] - fVar185;
                  local_1078 = CONCAT44((float)local_13d8,fVar154);
                  fVar154 = fVar154 - fVar115;
                  fVar158 = (float)local_13d8 - fVar115;
                  fVar160 = pfVar4[2] - fVar115;
                  fVar162 = pfVar3[2] - fVar115;
                  local_1458 = fVar135;
                  fStack_1454 = fVar143;
                  fStack_1450 = fVar153;
                  fStack_144c = fVar145;
                  local_ff8 = fVar135 - local_fb8;
                  fStack_ff4 = fVar143 - fStack_fb4;
                  fStack_ff0 = fVar153 - fStack_fb0;
                  fStack_fec = fVar145 - fStack_fac;
                  local_1478[0] = (uint)fVar154;
                  auStack_1474[0] = (uint)fVar158;
                  fStack_1470 = fVar160;
                  fStack_146c = fVar162;
                  local_fe8 = fVar154 - local_fa8;
                  fStack_fe4 = fVar158 - fStack_fa4;
                  fStack_fe0 = fVar160 - fStack_fa0;
                  fStack_fdc = fVar162 - fStack_f9c;
                  fStack_1484 = local_1488;
                  fStack_1480 = local_1488;
                  fStack_147c = local_1488;
                  local_1318 = *pfVar5 - local_1488;
                  fStack_1314 = (float)local_1338._0_4_ - local_1488;
                  fStack_1310 = (float)local_13c8 - local_1488;
                  fStack_130c = (float)local_1348._0_4_ - local_1488;
                  local_10a8 = CONCAT44((float)local_13c8,local_1348._0_4_);
                  local_1098 = *pfVar4;
                  fStack_1094 = *pfVar3;
                  local_1348._0_4_ = (float)local_1348._0_4_ - local_1488;
                  local_1348._4_4_ = (float)local_13c8 - local_1488;
                  fStack_1340 = *pfVar4 - local_1488;
                  fStack_133c = *pfVar3 - local_1488;
                  local_1008 = (float)local_1348._0_4_ - local_1318;
                  fStack_1004 = (float)local_1348._4_4_ - fStack_1314;
                  fStack_1000 = fStack_1340 - fStack_1310;
                  fStack_ffc = fStack_133c - fStack_130c;
                  local_1308 = (ray->super_RayK<1>).dir.field_0.m128[0];
                  local_14b8._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
                  auStack_1494._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
                  local_1328 = (local_ff8 * (fVar154 + local_fa8) -
                               local_fe8 * (fVar135 + local_fb8)) * local_1308 +
                               (local_fe8 * ((float)local_1348._0_4_ + local_1318) -
                               (fVar154 + local_fa8) * local_1008) * (float)local_14b8._4_4_ +
                               ((fVar135 + local_fb8) * local_1008 -
                               ((float)local_1348._0_4_ + local_1318) * local_ff8) *
                               (float)auStack_1494._0_4_;
                  fStack_1324 = (fStack_ff4 * (fVar158 + fStack_fa4) -
                                fStack_fe4 * (fVar143 + fStack_fb4)) * local_1308 +
                                (fStack_fe4 * ((float)local_1348._4_4_ + fStack_1314) -
                                (fVar158 + fStack_fa4) * fStack_1004) * (float)local_14b8._4_4_ +
                                ((fVar143 + fStack_fb4) * fStack_1004 -
                                ((float)local_1348._4_4_ + fStack_1314) * fStack_ff4) *
                                (float)auStack_1494._0_4_;
                  fStack_1320 = (fStack_ff0 * (fVar160 + fStack_fa0) -
                                fStack_fe0 * (fVar153 + fStack_fb0)) * local_1308 +
                                (fStack_fe0 * (fStack_1340 + fStack_1310) -
                                (fVar160 + fStack_fa0) * fStack_1000) * (float)local_14b8._4_4_ +
                                ((fVar153 + fStack_fb0) * fStack_1000 -
                                (fStack_1340 + fStack_1310) * fStack_ff0) *
                                (float)auStack_1494._0_4_;
                  fStack_131c = (fStack_fec * (fVar162 + fStack_f9c) -
                                fStack_fdc * (fVar145 + fStack_fac)) * local_1308 +
                                (fStack_fdc * (fStack_133c + fStack_130c) -
                                (fVar162 + fStack_f9c) * fStack_ffc) * (float)local_14b8._4_4_ +
                                ((fVar145 + fStack_fac) * fStack_ffc -
                                (fStack_133c + fStack_130c) * fStack_fec) *
                                (float)auStack_1494._0_4_;
                  fStack_1084 = pfVar2[1];
                  fStack_1080 = fStack_13b4;
                  fStack_107c = local_13b8;
                  local_1368 = fVar185;
                  fStack_1364 = fVar185;
                  fStack_1360 = fVar185;
                  fStack_135c = fVar185;
                  local_1168 = local_1088 - fVar185;
                  fStack_1164 = pfVar2[1] - fVar185;
                  fStack_1160 = fStack_13b4 - fVar185;
                  fStack_115c = local_13b8 - fVar185;
                  local_1068 = CONCAT44(pfVar2[2],local_1178);
                  local_1058._4_4_ = (float)local_13d8;
                  local_1058._0_4_ = local_13d8._4_4_;
                  local_1358 = fVar115;
                  fStack_1354 = fVar115;
                  fStack_1350 = fVar115;
                  fStack_134c = fVar115;
                  local_1178 = local_1178 - fVar115;
                  fStack_1174 = pfVar2[2] - fVar115;
                  fStack_1170 = local_13d8._4_4_ - fVar115;
                  fStack_116c = (float)local_13d8 - fVar115;
                  local_fc8 = local_fb8 - local_1168;
                  fStack_fc4 = fStack_fb4 - fStack_1164;
                  fStack_fc0 = fStack_fb0 - fStack_1160;
                  fStack_fbc = fStack_fac - fStack_115c;
                  local_fd8 = local_fa8 - local_1178;
                  fStack_fd4 = fStack_fa4 - fStack_1174;
                  fStack_fd0 = fStack_fa0 - fStack_1170;
                  fStack_fcc = fStack_f9c - fStack_116c;
                  fStack_1330 = auVar155._8_4_;
                  fStack_132c = auVar155._12_4_;
                  local_1188 = (float)local_1338._0_4_ - local_1488;
                  fStack_1184 = *pfVar2 - local_1488;
                  fStack_1180 = fStack_1330 - local_1488;
                  fStack_117c = fStack_132c - local_1488;
                  fVar193 = local_1318 - local_1188;
                  fVar159 = fStack_1314 - fStack_1184;
                  fVar202 = fStack_1310 - fStack_1180;
                  fVar206 = fStack_130c - fStack_117c;
                  local_1028._0_4_ =
                       (local_fc8 * (local_fa8 + local_1178) - local_fd8 * (local_fb8 + local_1168))
                       * local_1308 +
                       (local_fd8 * (local_1318 + local_1188) - (local_fa8 + local_1178) * fVar193)
                       * (float)local_14b8._4_4_ +
                       ((local_fb8 + local_1168) * fVar193 - (local_1318 + local_1188) * local_fc8)
                       * (float)auStack_1494._0_4_;
                  local_1028._4_4_ =
                       (fStack_fc4 * (fStack_fa4 + fStack_1174) -
                       fStack_fd4 * (fStack_fb4 + fStack_1164)) * local_1308 +
                       (fStack_fd4 * (fStack_1314 + fStack_1184) -
                       (fStack_fa4 + fStack_1174) * fVar159) * (float)local_14b8._4_4_ +
                       ((fStack_fb4 + fStack_1164) * fVar159 -
                       (fStack_1314 + fStack_1184) * fStack_fc4) * (float)auStack_1494._0_4_;
                  local_1028._8_4_ =
                       (fStack_fc0 * (fStack_fa0 + fStack_1170) -
                       fStack_fd0 * (fStack_fb0 + fStack_1160)) * local_1308 +
                       (fStack_fd0 * (fStack_1310 + fStack_1180) -
                       (fStack_fa0 + fStack_1170) * fVar202) * (float)local_14b8._4_4_ +
                       ((fStack_fb0 + fStack_1160) * fVar202 -
                       (fStack_1310 + fStack_1180) * fStack_fc0) * (float)auStack_1494._0_4_;
                  local_1028._12_4_ =
                       (fStack_fbc * (fStack_f9c + fStack_116c) -
                       fStack_fcc * (fStack_fac + fStack_115c)) * local_1308 +
                       (fStack_fcc * (fStack_130c + fStack_117c) -
                       (fStack_f9c + fStack_116c) * fVar206) * (float)local_14b8._4_4_ +
                       ((fStack_fac + fStack_115c) * fVar206 -
                       (fStack_130c + fStack_117c) * fStack_fbc) * (float)auStack_1494._0_4_;
                  fVar165 = local_1168 - fVar135;
                  fVar169 = fStack_1164 - fVar143;
                  fVar172 = fStack_1160 - fVar153;
                  fVar175 = fStack_115c - fVar145;
                  local_1018 = local_1178 - fVar154;
                  fStack_1014 = fStack_1174 - fVar158;
                  fStack_1010 = fStack_1170 - fVar160;
                  fStack_100c = fStack_116c - fVar162;
                  local_1138 = local_1168 + fVar135;
                  fStack_1134 = fStack_1164 + fVar143;
                  fStack_1130 = fStack_1160 + fVar153;
                  fStack_112c = fStack_115c + fVar145;
                  local_1158 = local_1178 + fVar154;
                  fStack_1154 = fStack_1174 + fVar158;
                  fStack_1150 = fStack_1170 + fVar160;
                  fStack_114c = fStack_116c + fVar162;
                  fVar183 = local_1188 - (float)local_1348._0_4_;
                  fVar164 = fStack_1184 - (float)local_1348._4_4_;
                  fVar187 = fStack_1180 - fStack_1340;
                  fVar189 = fStack_117c - fStack_133c;
                  local_1148 = local_1188 + (float)local_1348._0_4_;
                  fStack_1144 = fStack_1184 + (float)local_1348._4_4_;
                  fStack_1140 = fStack_1180 + fStack_1340;
                  fStack_113c = fStack_117c + fStack_133c;
                  local_1498 = (undefined1  [4])auStack_1494._0_4_;
                  auStack_1494._4_4_ = auStack_1494._0_4_;
                  fStack_148c = (float)auStack_1494._0_4_;
                  local_14b8._0_4_ = local_14b8._4_4_;
                  fStack_14b0 = (float)local_14b8._4_4_;
                  fStack_14ac = (float)local_14b8._4_4_;
                  fStack_1304 = local_1308;
                  fStack_1300 = local_1308;
                  fStack_12fc = local_1308;
                  auVar62._0_4_ =
                       (fVar165 * local_1158 - local_1018 * local_1138) * local_1308 +
                       (local_1018 * local_1148 - fVar183 * local_1158) * (float)local_14b8._4_4_ +
                       (fVar183 * local_1138 - fVar165 * local_1148) * (float)auStack_1494._0_4_;
                  auVar62._4_4_ =
                       (fVar169 * fStack_1154 - fStack_1014 * fStack_1134) * local_1308 +
                       (fStack_1014 * fStack_1144 - fVar164 * fStack_1154) * (float)local_14b8._4_4_
                       + (fVar164 * fStack_1134 - fVar169 * fStack_1144) * (float)auStack_1494._0_4_
                  ;
                  auVar62._8_4_ =
                       (fVar172 * fStack_1150 - fStack_1010 * fStack_1130) * local_1308 +
                       (fStack_1010 * fStack_1140 - fVar187 * fStack_1150) * (float)local_14b8._4_4_
                       + (fVar187 * fStack_1130 - fVar172 * fStack_1140) * (float)auStack_1494._0_4_
                  ;
                  auVar62._12_4_ =
                       (fVar175 * fStack_114c - fStack_100c * fStack_112c) * local_1308 +
                       (fStack_100c * fStack_113c - fVar189 * fStack_114c) * (float)local_14b8._4_4_
                       + (fVar189 * fStack_112c - fVar175 * fStack_113c) * (float)auStack_1494._0_4_
                  ;
                  auVar26._4_4_ = fStack_1324;
                  auVar26._0_4_ = local_1328;
                  auVar26._8_4_ = fStack_1320;
                  auVar26._12_4_ = fStack_131c;
                  local_12d8._0_4_ = local_1328 + local_1028._0_4_ + auVar62._0_4_;
                  local_12d8._4_4_ = fStack_1324 + local_1028._4_4_ + auVar62._4_4_;
                  fStack_12d0 = fStack_1320 + local_1028._8_4_ + auVar62._8_4_;
                  fStack_12cc = fStack_131c + local_1028._12_4_ + auVar62._12_4_;
                  auVar155 = minps(auVar26,local_1028);
                  auVar155 = minps(auVar155,auVar62);
                  auVar50 = maxps(auVar26,local_1028);
                  auVar50 = maxps(auVar50,auVar62);
                  fVar82 = ABS((float)local_12d8._0_4_);
                  fVar100 = ABS((float)local_12d8._4_4_);
                  fVar101 = ABS(fStack_12d0);
                  fVar102 = ABS(fStack_12cc);
                  auVar147._0_4_ =
                       -(uint)(auVar50._0_4_ <= fVar82 * 1.1920929e-07 ||
                              -(fVar82 * 1.1920929e-07) <= auVar155._0_4_) & local_1198;
                  auVar147._4_4_ =
                       -(uint)(auVar50._4_4_ <= fVar100 * 1.1920929e-07 ||
                              -(fVar100 * 1.1920929e-07) <= auVar155._4_4_) & uStack_1194;
                  auVar147._8_4_ =
                       -(uint)(auVar50._8_4_ <= fVar101 * 1.1920929e-07 ||
                              -(fVar101 * 1.1920929e-07) <= auVar155._8_4_) & uStack_1190;
                  auVar147._12_4_ =
                       -(uint)(auVar50._12_4_ <= fVar102 * 1.1920929e-07 ||
                              -(fVar102 * 1.1920929e-07) <= auVar155._12_4_) & uStack_118c;
                  iVar41 = movmskps((int)lVar30,auVar147);
                  local_1118 = ZEXT416(uVar34);
                  local_1128 = ZEXT416(uVar36);
                  _local_1338 = auVar125;
                  if (iVar41 == 0) {
LAB_00db3816:
                    uVar40 = (uint)pSVar31;
                    lVar30 = local_13e8;
                  }
                  else {
                    local_1048 = fVar82;
                    fStack_1044 = fVar100;
                    fStack_1040 = fVar101;
                    fStack_103c = fVar102;
                    local_1038 = fVar165;
                    fStack_1034 = fVar169;
                    fStack_1030 = fVar172;
                    fStack_102c = fVar175;
                    auVar108._0_4_ = local_ff8 * local_fd8 - local_fe8 * local_fc8;
                    auVar108._4_4_ = fStack_ff4 * fStack_fd4 - fStack_fe4 * fStack_fc4;
                    auVar108._8_4_ = fStack_ff0 * fStack_fd0 - fStack_fe0 * fStack_fc0;
                    auVar108._12_4_ = fStack_fec * fStack_fcc - fStack_fdc * fStack_fbc;
                    auVar87._0_4_ = local_fc8 * local_1018 - local_fd8 * fVar165;
                    auVar87._4_4_ = fStack_fc4 * fStack_1014 - fStack_fd4 * fVar169;
                    auVar87._8_4_ = fStack_fc0 * fStack_1010 - fStack_fd0 * fVar172;
                    auVar87._12_4_ = fStack_fbc * fStack_100c - fStack_fcc * fVar175;
                    auVar63._4_4_ =
                         -(uint)(ABS(fStack_fe4 * fStack_fc4) < ABS(fStack_fd4 * fVar169));
                    auVar63._0_4_ = -(uint)(ABS(local_fe8 * local_fc8) < ABS(local_fd8 * fVar165));
                    auVar63._8_4_ =
                         -(uint)(ABS(fStack_fe0 * fStack_fc0) < ABS(fStack_fd0 * fVar172));
                    auVar63._12_4_ =
                         -(uint)(ABS(fStack_fdc * fStack_fbc) < ABS(fStack_fcc * fVar175));
                    local_1278 = blendvps(auVar87,auVar108,auVar63);
                    auVar177._0_4_ = local_fe8 * fVar193 - local_1008 * local_fd8;
                    auVar177._4_4_ = fStack_fe4 * fVar159 - fStack_1004 * fStack_fd4;
                    auVar177._8_4_ = fStack_fe0 * fVar202 - fStack_1000 * fStack_fd0;
                    auVar177._12_4_ = fStack_fdc * fVar206 - fStack_ffc * fStack_fcc;
                    auVar191._0_4_ = local_fd8 * fVar183 - fVar193 * local_1018;
                    auVar191._4_4_ = fStack_fd4 * fVar164 - fVar159 * fStack_1014;
                    auVar191._8_4_ = fStack_fd0 * fVar187 - fVar202 * fStack_1010;
                    auVar191._12_4_ = fStack_fcc * fVar189 - fVar206 * fStack_100c;
                    auVar64._4_4_ =
                         -(uint)(ABS(fStack_1004 * fStack_fd4) < ABS(fVar159 * fStack_1014));
                    auVar64._0_4_ = -(uint)(ABS(local_1008 * local_fd8) < ABS(fVar193 * local_1018))
                    ;
                    auVar64._8_4_ =
                         -(uint)(ABS(fStack_1000 * fStack_fd0) < ABS(fVar202 * fStack_1010));
                    auVar64._12_4_ =
                         -(uint)(ABS(fStack_ffc * fStack_fcc) < ABS(fVar206 * fStack_100c));
                    local_1268 = blendvps(auVar191,auVar177,auVar64);
                    auVar141._0_4_ = local_1008 * local_fc8 - local_ff8 * fVar193;
                    auVar141._4_4_ = fStack_1004 * fStack_fc4 - fStack_ff4 * fVar159;
                    auVar141._8_4_ = fStack_1000 * fStack_fc0 - fStack_ff0 * fVar202;
                    auVar141._12_4_ = fStack_ffc * fStack_fbc - fStack_fec * fVar206;
                    auVar196._0_4_ = fVar193 * fVar165 - local_fc8 * fVar183;
                    auVar196._4_4_ = fVar159 * fVar169 - fStack_fc4 * fVar164;
                    auVar196._8_4_ = fVar202 * fVar172 - fStack_fc0 * fVar187;
                    auVar196._12_4_ = fVar206 * fVar175 - fStack_fbc * fVar189;
                    auVar65._4_4_ = -(uint)(ABS(fStack_ff4 * fVar159) < ABS(fStack_fc4 * fVar164));
                    auVar65._0_4_ = -(uint)(ABS(local_ff8 * fVar193) < ABS(local_fc8 * fVar183));
                    auVar65._8_4_ = -(uint)(ABS(fStack_ff0 * fVar202) < ABS(fStack_fc0 * fVar187));
                    auVar65._12_4_ = -(uint)(ABS(fStack_fec * fVar206) < ABS(fStack_fbc * fVar189));
                    local_1258 = blendvps(auVar196,auVar141,auVar65);
                    fVar165 = local_1308 * local_1278._0_4_ +
                              (float)local_14b8._4_4_ * local_1268._0_4_ +
                              (float)auStack_1494._0_4_ * local_1258._0_4_;
                    fVar169 = local_1308 * local_1278._4_4_ +
                              (float)local_14b8._4_4_ * local_1268._4_4_ +
                              (float)auStack_1494._0_4_ * local_1258._4_4_;
                    fVar172 = local_1308 * local_1278._8_4_ +
                              (float)local_14b8._4_4_ * local_1268._8_4_ +
                              (float)auStack_1494._0_4_ * local_1258._8_4_;
                    fVar175 = local_1308 * local_1278._12_4_ +
                              (float)local_14b8._4_4_ * local_1268._12_4_ +
                              (float)auStack_1494._0_4_ * local_1258._12_4_;
                    auVar66._0_4_ = fVar165 + fVar165;
                    auVar66._4_4_ = fVar169 + fVar169;
                    auVar66._8_4_ = fVar172 + fVar172;
                    auVar66._12_4_ = fVar175 + fVar175;
                    auVar123._0_4_ = local_fb8 * local_1268._0_4_ + local_fa8 * local_1258._0_4_;
                    auVar123._4_4_ = fStack_fb4 * local_1268._4_4_ + fStack_fa4 * local_1258._4_4_;
                    auVar123._8_4_ = fStack_fb0 * local_1268._8_4_ + fStack_fa0 * local_1258._8_4_;
                    auVar123._12_4_ =
                         fStack_fac * local_1268._12_4_ + fStack_f9c * local_1258._12_4_;
                    fVar183 = local_1318 * local_1278._0_4_ + auVar123._0_4_;
                    fVar164 = fStack_1314 * local_1278._4_4_ + auVar123._4_4_;
                    fVar187 = fStack_1310 * local_1278._8_4_ + auVar123._8_4_;
                    fVar189 = fStack_130c * local_1278._12_4_ + auVar123._12_4_;
                    auVar155 = rcpps(auVar123,auVar66);
                    fVar165 = auVar155._0_4_;
                    fVar169 = auVar155._4_4_;
                    fVar172 = auVar155._8_4_;
                    fVar175 = auVar155._12_4_;
                    auVar109._0_4_ =
                         ((1.0 - auVar66._0_4_ * fVar165) * fVar165 + fVar165) * (fVar183 + fVar183)
                    ;
                    auVar109._4_4_ =
                         ((1.0 - auVar66._4_4_ * fVar169) * fVar169 + fVar169) * (fVar164 + fVar164)
                    ;
                    auVar109._8_4_ =
                         ((1.0 - auVar66._8_4_ * fVar172) * fVar172 + fVar172) * (fVar187 + fVar187)
                    ;
                    auVar109._12_4_ =
                         ((1.0 - auVar66._12_4_ * fVar175) * fVar175 + fVar175) *
                         (fVar189 + fVar189);
                    fVar165 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar67._0_4_ =
                         (int)((uint)(auVar66._0_4_ != 0.0 &&
                                     (auVar109._0_4_ <= fVar136 && fVar165 <= auVar109._0_4_)) *
                              -0x80000000) >> 0x1f;
                    auVar67._4_4_ =
                         (int)((uint)(auVar66._4_4_ != 0.0 &&
                                     (auVar109._4_4_ <= fVar136 && fVar165 <= auVar109._4_4_)) *
                              -0x80000000) >> 0x1f;
                    auVar67._8_4_ =
                         (int)((uint)(auVar66._8_4_ != 0.0 &&
                                     (auVar109._8_4_ <= fVar136 && fVar165 <= auVar109._8_4_)) *
                              -0x80000000) >> 0x1f;
                    auVar67._12_4_ =
                         (int)((uint)(auVar66._12_4_ != 0.0 &&
                                     (auVar109._12_4_ <= fVar136 && fVar165 <= auVar109._12_4_)) *
                              -0x80000000) >> 0x1f;
                    auVar68 = auVar67 & auVar147;
                    iVar41 = movmskps(uVar34,auVar68);
                    if (iVar41 == 0) goto LAB_00db3816;
                    local_12c8 = &local_14d1;
                    local_12b8 = auVar68;
                    local_1288 = auVar109;
                    fVar136 = (float)(int)(*(ushort *)(local_13e8 + 8 + lVar44) - 1);
                    auVar155 = rcpss(ZEXT416((uint)fVar136),ZEXT416((uint)fVar136));
                    fVar165 = (float)(int)(*(ushort *)(local_13e8 + 10 + lVar44) - 1);
                    fStack_12ec = (2.0 - fVar136 * auVar155._0_4_) * auVar155._0_4_;
                    auVar155 = rcpss(ZEXT416((uint)fVar165),ZEXT416((uint)fVar165));
                    fVar136 = (2.0 - fVar165 * auVar155._0_4_) * auVar155._0_4_;
                    local_12f8._0_4_ =
                         fStack_12ec * (local_1328 + (float)uVar34 * (float)local_12d8._0_4_);
                    local_12f8._4_4_ =
                         fStack_12ec * (fStack_1324 + (float)(uVar34 + 1) * (float)local_12d8._4_4_)
                    ;
                    fStack_12f0 = fStack_12ec * (fStack_1320 + (float)(uVar34 + 1) * fStack_12d0);
                    fStack_12ec = fStack_12ec * (fStack_131c + (float)uVar34 * fStack_12cc);
                    auVar88._0_4_ = (float)uVar36 * (float)local_12d8._0_4_ + local_1028._0_4_;
                    auVar88._4_4_ = (float)uVar36 * (float)local_12d8._4_4_ + local_1028._4_4_;
                    auVar88._8_4_ = (float)(uVar36 + 1) * fStack_12d0 + local_1028._8_4_;
                    auVar88._12_4_ = (float)(uVar36 + 1) * fStack_12cc + local_1028._12_4_;
                    local_12e8._4_4_ = fVar136 * auVar88._4_4_;
                    local_12e8._0_4_ = fVar136 * auVar88._0_4_;
                    fStack_12e0 = fVar136 * auVar88._8_4_;
                    fStack_12dc = fVar136 * auVar88._12_4_;
                    pGVar11 = (pSVar31->geometries).items[local_14c4._4_8_].ptr;
                    uVar27 = (ray->super_RayK<1>).mask;
                    pSVar31 = (Scene *)(ulong)uVar27;
                    if ((pGVar11->mask & uVar27) == 0) goto LAB_00db3816;
                    local_1448 = auVar68;
                    auVar155 = rcpps(auVar88,_local_12d8);
                    fVar165 = auVar155._0_4_;
                    fVar169 = auVar155._4_4_;
                    fVar172 = auVar155._8_4_;
                    fVar175 = auVar155._12_4_;
                    fVar82 = (float)(-(uint)(1e-18 <= fVar82) &
                                    (uint)(((float)DAT_01f7ba10 - (float)local_12d8._0_4_ * fVar165)
                                           * fVar165 + fVar165));
                    fVar100 = (float)(-(uint)(1e-18 <= fVar100) &
                                     (uint)((DAT_01f7ba10._4_4_ - (float)local_12d8._4_4_ * fVar169)
                                            * fVar169 + fVar169));
                    fVar101 = (float)(-(uint)(1e-18 <= fVar101) &
                                     (uint)((DAT_01f7ba10._8_4_ - fStack_12d0 * fVar172) * fVar172 +
                                           fVar172));
                    fVar102 = (float)(-(uint)(1e-18 <= fVar102) &
                                     (uint)((DAT_01f7ba10._12_4_ - fStack_12cc * fVar175) * fVar175
                                           + fVar175));
                    auVar124._0_4_ = (float)local_12f8._0_4_ * fVar82;
                    auVar124._4_4_ = (float)local_12f8._4_4_ * fVar100;
                    auVar124._8_4_ = fStack_12f0 * fVar101;
                    auVar124._12_4_ = fStack_12ec * fVar102;
                    local_12a8 = minps(auVar124,_DAT_01f7ba10);
                    auVar142._0_4_ = fVar136 * auVar88._0_4_ * fVar82;
                    auVar142._4_4_ = fVar136 * auVar88._4_4_ * fVar100;
                    auVar142._8_4_ = fVar136 * auVar88._8_4_ * fVar101;
                    auVar142._12_4_ = fVar136 * auVar88._12_4_ * fVar102;
                    local_1298 = minps(auVar142,_DAT_01f7ba10);
                    auVar125 = blendvps(_DAT_01f7a9f0,auVar109,auVar68);
                    auVar110._4_4_ = auVar125._0_4_;
                    auVar110._0_4_ = auVar125._4_4_;
                    auVar110._8_4_ = auVar125._12_4_;
                    auVar110._12_4_ = auVar125._8_4_;
                    auVar155 = minps(auVar110,auVar125);
                    auVar89._0_8_ = auVar155._8_8_;
                    auVar89._8_4_ = auVar155._0_4_;
                    auVar89._12_4_ = auVar155._4_4_;
                    auVar155 = minps(auVar89,auVar155);
                    auVar90._0_8_ =
                         CONCAT44(-(uint)(auVar155._4_4_ == auVar125._4_4_) & auVar68._4_4_,
                                  -(uint)(auVar155._0_4_ == auVar125._0_4_) & auVar68._0_4_);
                    auVar90._8_4_ = -(uint)(auVar155._8_4_ == auVar125._8_4_) & auVar68._8_4_;
                    auVar90._12_4_ = -(uint)(auVar155._12_4_ == auVar125._12_4_) & auVar68._12_4_;
                    iVar41 = movmskps(uVar27,auVar90);
                    if (iVar41 != 0) {
                      auVar68._8_4_ = auVar90._8_4_;
                      auVar68._0_8_ = auVar90._0_8_;
                      auVar68._12_4_ = auVar90._12_4_;
                    }
                    uVar27 = movmskps(iVar41,auVar68);
                    lVar30 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                      }
                    }
                    pRVar13 = local_14d0->args;
                    if ((pRVar13->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar136 = *(float *)(local_12a8 + lVar30 * 4);
                      fVar82 = *(float *)(local_1298 + lVar30 * 4);
                      fVar100 = *(float *)(local_1278 + lVar30 * 4);
                      fVar101 = *(float *)(local_1268 + lVar30 * 4);
                      fVar102 = *(float *)(local_1258 + lVar30 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1288 + lVar30 * 4);
                      (ray->Ng).field_0.field_0.x = fVar100;
                      (ray->Ng).field_0.field_0.y = fVar101;
                      (ray->Ng).field_0.field_0.z = fVar102;
                      ray->u = fVar136;
                      ray->v = fVar82;
                      ray->primID = uVar144;
                      ray->geomID = uVar40;
                      pRVar47 = local_14d0->user;
                      ray->instID[0] = pRVar47->instID[0];
                      uVar40 = pRVar47->instPrimID[0];
                      ray->instPrimID[0] = uVar40;
                    }
                    else {
                      pRVar47 = local_14d0->user;
                      _local_14b8 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                      _local_1498 = auVar109;
                      while( true ) {
                        local_139c = *(undefined4 *)(local_12a8 + lVar30 * 4);
                        local_1398 = *(undefined4 *)(local_1298 + lVar30 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1288 + lVar30 * 4);
                        local_13a8 = *(float *)(local_1278 + lVar30 * 4);
                        local_13a4 = *(undefined4 *)(local_1268 + lVar30 * 4);
                        local_13a0 = *(undefined4 *)(local_1258 + lVar30 * 4);
                        local_1394 = (int)local_1460;
                        local_1390 = (int)local_14c4._4_8_;
                        local_138c = pRVar47->instID[0];
                        local_1388 = pRVar47->instPrimID[0];
                        local_14c4._0_4_ = -NAN;
                        local_1428.valid = (int *)local_14c4;
                        local_1428.geometryUserPtr = pGVar11->userPtr;
                        local_1428.context = pRVar47;
                        local_1428.ray = (RTCRayN *)ray;
                        local_1428.hit = (RTCHitN *)&local_13a8;
                        local_1428.N = 1;
                        if (((pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                            ((*pGVar11->intersectionFilterN)(&local_1428), auVar109 = _local_1498,
                            (((RayK<1> *)local_1428.valid)->org).field_0.m128[0] != 0.0)) &&
                           ((pRVar13->filter == (RTCFilterFunctionN)0x0 ||
                            ((((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                               RTC_RAY_QUERY_FLAG_INCOHERENT &&
                              (((pGVar11->field_8).field_0x2 & 0x40) == 0)) ||
                             ((*pRVar13->filter)(&local_1428), auVar109 = _local_1498,
                             (((RayK<1> *)local_1428.valid)->org).field_0.m128[0] != 0.0)))))) {
                          (((Vec3f *)((long)local_1428.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_1428.hit;
                          (((Vec3f *)((long)local_1428.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_1428.hit + 4);
                          (((Vec3f *)((long)local_1428.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_1428.hit + 8);
                          *(float *)((long)local_1428.ray + 0x3c) = *(float *)(local_1428.hit + 0xc)
                          ;
                          *(float *)((long)local_1428.ray + 0x40) =
                               *(float *)(local_1428.hit + 0x10);
                          *(float *)((long)local_1428.ray + 0x44) =
                               *(float *)(local_1428.hit + 0x14);
                          *(float *)((long)local_1428.ray + 0x48) =
                               *(float *)(local_1428.hit + 0x18);
                          *(float *)((long)local_1428.ray + 0x4c) =
                               *(float *)(local_1428.hit + 0x1c);
                          *(float *)((long)local_1428.ray + 0x50) =
                               *(float *)(local_1428.hit + 0x20);
                          pRVar33 = (RayHit *)local_1428.ray;
                        }
                        else {
                          (ray->super_RayK<1>).tfar = (float)local_14b8._0_4_;
                          pRVar33 = (RayHit *)local_1428.valid;
                          auVar109 = _local_1498;
                        }
                        *(undefined4 *)(local_1448 + lVar30 * 4) = 0;
                        fVar136 = (ray->super_RayK<1>).tfar;
                        auVar74._0_4_ = -(uint)(auVar109._0_4_ <= fVar136) & local_1448._0_4_;
                        auVar74._4_4_ = -(uint)(auVar109._4_4_ <= fVar136) & local_1448._4_4_;
                        auVar74._8_4_ = -(uint)(auVar109._8_4_ <= fVar136) & local_1448._8_4_;
                        auVar74._12_4_ = -(uint)(auVar109._12_4_ <= fVar136) & local_1448._12_4_;
                        local_1448 = auVar74;
                        iVar41 = movmskps((int)pRVar33,auVar74);
                        if (iVar41 == 0) break;
                        local_14b8._0_4_ = (ray->super_RayK<1>).tfar;
                        local_14b8._4_4_ = (ray->super_RayK<1>).mask;
                        fStack_14b0 = (float)(ray->super_RayK<1>).id;
                        fStack_14ac = (float)(ray->super_RayK<1>).flags;
                        auVar125 = blendvps(_DAT_01f7a9f0,auVar109,auVar74);
                        auVar129._4_4_ = auVar125._0_4_;
                        auVar129._0_4_ = auVar125._4_4_;
                        auVar129._8_4_ = auVar125._12_4_;
                        auVar129._12_4_ = auVar125._8_4_;
                        auVar155 = minps(auVar129,auVar125);
                        auVar96._0_8_ = auVar155._8_8_;
                        auVar96._8_4_ = auVar155._0_4_;
                        auVar96._12_4_ = auVar155._4_4_;
                        auVar155 = minps(auVar96,auVar155);
                        auVar97._0_8_ =
                             CONCAT44(-(uint)(auVar155._4_4_ == auVar125._4_4_) & auVar74._4_4_,
                                      -(uint)(auVar155._0_4_ == auVar125._0_4_) & auVar74._0_4_);
                        auVar97._8_4_ = -(uint)(auVar155._8_4_ == auVar125._8_4_) & auVar74._8_4_;
                        auVar97._12_4_ =
                             -(uint)(auVar155._12_4_ == auVar125._12_4_) & auVar74._12_4_;
                        iVar41 = movmskps(iVar41,auVar97);
                        if (iVar41 != 0) {
                          auVar74._8_4_ = auVar97._8_4_;
                          auVar74._0_8_ = auVar97._0_8_;
                          auVar74._12_4_ = auVar97._12_4_;
                        }
                        uVar28 = movmskps(iVar41,auVar74);
                        uVar37 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar28);
                        lVar30 = 0;
                        if (uVar37 != 0) {
                          for (; (uVar37 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                          }
                        }
                      }
                      local_1488 = (ray->super_RayK<1>).org.field_0.m128[0];
                      fVar185 = (ray->super_RayK<1>).org.field_0.m128[1];
                      fVar115 = (ray->super_RayK<1>).org.field_0.m128[2];
                      local_1308 = (ray->super_RayK<1>).dir.field_0.m128[0];
                      local_14b8._4_4_ = *(float *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
                      auStack_1494._0_4_ = *(float *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
                      fStack_1304 = local_1308;
                      fStack_1300 = local_1308;
                      fStack_12fc = local_1308;
                      fVar135 = local_1098 - fVar185;
                      fVar143 = fStack_1094 - fVar185;
                      fVar153 = fStack_1090 - fVar185;
                      fVar145 = fStack_108c - fVar185;
                      fVar154 = (float)local_1078 - fVar115;
                      fVar158 = local_1078._4_4_ - fVar115;
                      fVar160 = fStack_1070 - fVar115;
                      fVar162 = fStack_106c - fVar115;
                      local_1148 = ((float)local_10a8 - local_1488) +
                                   ((float)local_1338._0_4_ - local_1488);
                      fStack_1144 = (local_10a8._4_4_ - local_1488) +
                                    ((float)local_1338._4_4_ - local_1488);
                      fStack_1140 = (fStack_10a0 - local_1488) + (fStack_1330 - local_1488);
                      fStack_113c = (fStack_109c - local_1488) + (fStack_132c - local_1488);
                      local_1138 = fVar135 + (local_1088 - fVar185);
                      fStack_1134 = fVar143 + (fStack_1084 - fVar185);
                      fStack_1130 = fVar153 + (fStack_1080 - fVar185);
                      fStack_112c = fVar145 + (fStack_107c - fVar185);
                      local_1158 = fVar154 + ((float)local_1068 - fVar115);
                      fStack_1154 = fVar158 + (local_1068._4_4_ - fVar115);
                      fStack_1150 = fVar160 + (fStack_1060 - fVar115);
                      fStack_114c = fVar162 + (fStack_105c - fVar115);
                      local_1178 = (float)local_1068 - fVar115;
                      fStack_1174 = local_1068._4_4_ - fVar115;
                      fStack_1170 = fStack_1060 - fVar115;
                      fStack_116c = fStack_105c - fVar115;
                      local_1168 = local_1088 - fVar185;
                      fStack_1164 = fStack_1084 - fVar185;
                      fStack_1160 = fStack_1080 - fVar185;
                      fStack_115c = fStack_107c - fVar185;
                      local_1188 = (float)local_1338._0_4_ - local_1488;
                      fStack_1184 = (float)local_1338._4_4_ - local_1488;
                      fStack_1180 = fStack_1330 - local_1488;
                      fStack_117c = fStack_132c - local_1488;
                      local_1348._4_4_ = local_10a8._4_4_ - local_1488;
                      local_1348._0_4_ = (float)local_10a8 - local_1488;
                      fStack_1340 = fStack_10a0 - local_1488;
                      fStack_133c = fStack_109c - local_1488;
                      uVar40 = 0;
                    }
                    local_14b8._0_4_ = local_14b8._4_4_;
                    fStack_14b0 = (float)local_14b8._4_4_;
                    fStack_14ac = (float)local_14b8._4_4_;
                    local_1498 = (undefined1  [4])auStack_1494._0_4_;
                    auStack_1494._4_4_ = auStack_1494._0_4_;
                    fStack_148c = (float)auStack_1494._0_4_;
                    uVar39 = local_1430;
                    lVar30 = local_13e8;
                    lVar44 = local_13f8._0_8_;
                  }
                  local_13d8._0_4_ = (float)local_13d8 - fVar115;
                  local_13d8._4_4_ = local_13d8._4_4_ - fVar115;
                  fStack_13d0 = fStack_13d0 - fVar115;
                  fStack_13cc = fStack_13cc - fVar115;
                  local_13b8 = local_13b8 - fVar185;
                  fStack_13b4 = fStack_13b4 - fVar185;
                  fStack_13b0 = fStack_13b0 - fVar185;
                  fStack_13ac = fStack_13ac - fVar185;
                  local_13c8._0_4_ = (float)local_13c8 - local_1488;
                  local_13c8._4_4_ = local_13c8._4_4_ - local_1488;
                  fStack_13c0 = fStack_13c0 - local_1488;
                  fStack_13bc = fStack_13bc - local_1488;
                  local_1458 = local_1188 - (float)local_13c8;
                  fStack_1454 = fStack_1184 - local_13c8._4_4_;
                  fStack_1450 = fStack_1180 - fStack_13c0;
                  fStack_144c = fStack_117c - fStack_13bc;
                  fVar194 = local_1168 - local_13b8;
                  fVar199 = fStack_1164 - fStack_13b4;
                  fVar203 = fStack_1160 - fStack_13b0;
                  fVar207 = fStack_115c - fStack_13ac;
                  local_1318 = local_1178 - (float)local_13d8;
                  fStack_1314 = fStack_1174 - local_13d8._4_4_;
                  fStack_1310 = fStack_1170 - fStack_13d0;
                  fStack_130c = fStack_116c - fStack_13cc;
                  local_1478[0] = (uint)(fVar135 - local_1168);
                  auStack_1474[0] = (uint)(fVar143 - fStack_1164);
                  fStack_1470 = fVar153 - fStack_1160;
                  fStack_146c = fVar145 - fStack_115c;
                  local_1328 = fVar154 - local_1178;
                  fStack_1324 = fVar158 - fStack_1174;
                  fStack_1320 = fVar160 - fStack_1170;
                  fStack_131c = fVar162 - fStack_116c;
                  fVar136 = (float)local_1348._0_4_ - local_1188;
                  fVar115 = (float)local_1348._4_4_ - fStack_1184;
                  fStack_13e0 = fStack_1340 - fStack_1180;
                  fStack_13dc = fStack_133c - fStack_117c;
                  local_1488 = fVar194;
                  fStack_1484 = fVar199;
                  fStack_1480 = fVar203;
                  fStack_147c = fVar207;
                  fVar183 = local_13b8 - fVar135;
                  fVar164 = fStack_13b4 - fVar143;
                  fVar161 = fStack_13b0 - fVar153;
                  fVar163 = fStack_13ac - fVar145;
                  fVar82 = local_14b8._0_4_;
                  fVar100 = local_14b8._4_4_;
                  fVar172 = local_14b8._8_4_;
                  fVar175 = local_14b8._12_4_;
                  fVar195 = (float)local_13d8 - fVar154;
                  fVar200 = local_13d8._4_4_ - fVar158;
                  fVar204 = fStack_13d0 - fVar160;
                  fVar208 = fStack_13cc - fVar162;
                  fVar184 = (fVar194 * (local_1178 + (float)local_13d8) -
                            local_1318 * (local_1168 + local_13b8)) * fStack_12fc +
                            (local_1318 * (local_1188 + (float)local_13c8) -
                            (local_1178 + (float)local_13d8) * local_1458) * fVar82 +
                            ((local_1168 + local_13b8) * local_1458 -
                            (local_1188 + (float)local_13c8) * fVar194) * (float)local_1498;
                  fVar186 = (fVar199 * (fStack_1174 + local_13d8._4_4_) -
                            fStack_1314 * (fStack_1164 + fStack_13b4)) * fStack_12fc +
                            (fStack_1314 * (fStack_1184 + local_13c8._4_4_) -
                            (fStack_1174 + local_13d8._4_4_) * fStack_1454) * fVar100 +
                            ((fStack_1164 + fStack_13b4) * fStack_1454 -
                            (fStack_1184 + local_13c8._4_4_) * fVar199) * (float)auStack_1494._0_4_;
                  fVar188 = (fVar203 * (fStack_1170 + fStack_13d0) -
                            fStack_1310 * (fStack_1160 + fStack_13b0)) * fStack_12fc +
                            (fStack_1310 * (fStack_1180 + fStack_13c0) -
                            (fStack_1170 + fStack_13d0) * fStack_1450) * fVar172 +
                            ((fStack_1160 + fStack_13b0) * fStack_1450 -
                            (fStack_1180 + fStack_13c0) * fVar203) * (float)auStack_1494._4_4_;
                  fVar190 = (fVar207 * (fStack_116c + fStack_13cc) -
                            fStack_130c * (fStack_115c + fStack_13ac)) * fStack_12fc +
                            (fStack_130c * (fStack_117c + fStack_13bc) -
                            (fStack_116c + fStack_13cc) * fStack_144c) * fVar175 +
                            ((fStack_115c + fStack_13ac) * fStack_144c -
                            (fStack_117c + fStack_13bc) * fVar207) * fStack_148c;
                  fVar166 = (float)local_13c8 - (float)local_1348._0_4_;
                  fVar170 = local_13c8._4_4_ - (float)local_1348._4_4_;
                  fVar173 = fStack_13c0 - fStack_1340;
                  fVar176 = fStack_13bc - fStack_133c;
                  auVar192._0_4_ =
                       (fVar183 * (fVar154 + (float)local_13d8) - fVar195 * (fVar135 + local_13b8))
                       * fStack_12fc +
                       (fVar195 * ((float)local_1348._0_4_ + (float)local_13c8) -
                       (fVar154 + (float)local_13d8) * fVar166) * fVar82 +
                       ((fVar135 + local_13b8) * fVar166 -
                       ((float)local_1348._0_4_ + (float)local_13c8) * fVar183) * (float)local_1498;
                  auVar192._4_4_ =
                       (fVar164 * (fVar158 + local_13d8._4_4_) - fVar200 * (fVar143 + fStack_13b4))
                       * fStack_12fc +
                       (fVar200 * ((float)local_1348._4_4_ + local_13c8._4_4_) -
                       (fVar158 + local_13d8._4_4_) * fVar170) * fVar100 +
                       ((fVar143 + fStack_13b4) * fVar170 -
                       ((float)local_1348._4_4_ + local_13c8._4_4_) * fVar164) *
                       (float)auStack_1494._0_4_;
                  auVar192._8_4_ =
                       (fVar161 * (fVar160 + fStack_13d0) - fVar204 * (fVar153 + fStack_13b0)) *
                       fStack_12fc +
                       (fVar204 * (fStack_1340 + fStack_13c0) - (fVar160 + fStack_13d0) * fVar173) *
                       fVar172 + ((fVar153 + fStack_13b0) * fVar173 -
                                 (fStack_1340 + fStack_13c0) * fVar161) * (float)auStack_1494._4_4_;
                  auVar192._12_4_ =
                       (fVar163 * (fVar162 + fStack_13cc) - fVar208 * (fVar145 + fStack_13ac)) *
                       fStack_12fc +
                       (fVar208 * (fStack_133c + fStack_13bc) - (fVar162 + fStack_13cc) * fVar176) *
                       fVar175 + ((fVar145 + fStack_13ac) * fVar176 -
                                 (fStack_133c + fStack_13bc) * fVar163) * fStack_148c;
                  local_13e8 = CONCAT44(fVar115,fVar136);
                  local_13f8._0_8_ = CONCAT44(fVar186,fVar184);
                  local_13f8._8_4_ = fVar188;
                  local_13f8._12_4_ = fVar190;
                  auVar69._0_4_ =
                       ((float)local_1478[0] * local_1158 - local_1328 * local_1138) * fStack_12fc +
                       (local_1328 * local_1148 - local_1158 * fVar136) * fVar82 +
                       (local_1138 * fVar136 - local_1148 * (float)local_1478[0]) *
                       (float)local_1498;
                  auVar69._4_4_ =
                       ((float)auStack_1474[0] * fStack_1154 - fStack_1324 * fStack_1134) *
                       fStack_12fc +
                       (fStack_1324 * fStack_1144 - fStack_1154 * fVar115) * fVar100 +
                       (fStack_1134 * fVar115 - fStack_1144 * (float)auStack_1474[0]) *
                       (float)auStack_1494._0_4_;
                  auVar69._8_4_ =
                       (fStack_1470 * fStack_1150 - fStack_1320 * fStack_1130) * fStack_12fc +
                       (fStack_1320 * fStack_1140 - fStack_1150 * fStack_13e0) * fVar172 +
                       (fStack_1130 * fStack_13e0 - fStack_1140 * fStack_1470) *
                       (float)auStack_1494._4_4_;
                  auVar69._12_4_ =
                       (fStack_146c * fStack_114c - fStack_131c * fStack_112c) * fStack_12fc +
                       (fStack_131c * fStack_113c - fStack_114c * fStack_13dc) * fVar175 +
                       (fStack_112c * fStack_13dc - fStack_113c * fStack_146c) * fStack_148c;
                  local_12d8._0_4_ = fVar184 + auVar192._0_4_ + auVar69._0_4_;
                  local_12d8._4_4_ = fVar186 + auVar192._4_4_ + auVar69._4_4_;
                  fStack_12d0 = fVar188 + auVar192._8_4_ + auVar69._8_4_;
                  fStack_12cc = fVar190 + auVar192._12_4_ + auVar69._12_4_;
                  local_1348 = (undefined1  [8])
                               (CONCAT44(local_12d8._4_4_,local_12d8._0_4_) & 0x7fffffff7fffffff);
                  fStack_1340 = ABS(fStack_12d0);
                  fStack_133c = ABS(fStack_12cc);
                  auVar111._8_4_ = fVar188;
                  auVar111._0_8_ = local_13f8._0_8_;
                  auVar111._12_4_ = fVar190;
                  auVar155 = minps(auVar111,auVar192);
                  auVar50 = minps(auVar155,auVar69);
                  auVar91._8_4_ = fVar188;
                  auVar91._0_8_ = local_13f8._0_8_;
                  auVar91._12_4_ = fVar190;
                  auVar155 = maxps(auVar91,auVar192);
                  auVar125 = maxps(auVar155,auVar69);
                  auVar155 = _local_1348;
                  auVar92._4_4_ =
                       -(uint)(auVar125._4_4_ <= ABS((float)local_12d8._4_4_) * 1.1920929e-07);
                  auVar92._0_4_ =
                       -(uint)(auVar125._0_4_ <= ABS((float)local_12d8._0_4_) * 1.1920929e-07);
                  auVar92._8_4_ = -(uint)(auVar125._8_4_ <= fStack_1340 * 1.1920929e-07);
                  auVar92._12_4_ = -(uint)(auVar125._12_4_ <= fStack_133c * 1.1920929e-07);
                  auVar112._4_4_ =
                       -(uint)(-(ABS((float)local_12d8._4_4_) * 1.1920929e-07) <= auVar50._4_4_);
                  auVar112._0_4_ =
                       -(uint)(-(ABS((float)local_12d8._0_4_) * 1.1920929e-07) <= auVar50._0_4_);
                  auVar112._8_4_ = -(uint)(-(fStack_1340 * 1.1920929e-07) <= auVar50._8_4_);
                  auVar112._12_4_ = -(uint)(-(fStack_133c * 1.1920929e-07) <= auVar50._12_4_);
                  auVar92 = auVar92 | auVar112;
                  auVar93._0_4_ = auVar92._0_4_ & local_1198;
                  auVar93._4_4_ = auVar92._4_4_ & uStack_1194;
                  auVar93._8_4_ = auVar92._8_4_ & uStack_1190;
                  auVar93._12_4_ = auVar92._12_4_ & uStack_118c;
                  iVar41 = movmskps(uVar40,auVar93);
                  context = local_14d0;
                  uVar37 = local_11f0;
                  uVar42 = local_11e8;
                  uVar43 = local_11f8;
                  uVar46 = local_14a0;
                  auVar125 = local_1058;
                  fVar185 = local_10e8;
                  fVar162 = fStack_10e4;
                  fVar135 = fStack_10e0;
                  fVar143 = fStack_10dc;
                  fVar153 = local_1108;
                  fVar145 = fStack_1104;
                  fVar165 = fStack_1100;
                  fVar169 = fStack_10fc;
                  fVar159 = local_10b8;
                  fVar187 = fStack_10b4;
                  fVar189 = fStack_10b0;
                  fVar193 = fStack_10ac;
                  fVar171 = local_10c8;
                  fVar202 = fStack_10c4;
                  fVar206 = fStack_10c0;
                  fVar174 = fStack_10bc;
                  fVar154 = local_10d8;
                  fVar180 = fStack_10d4;
                  fVar181 = fStack_10d0;
                  fVar182 = fStack_10cc;
                  fVar158 = local_11a8;
                  fVar101 = fStack_11a4;
                  fVar160 = fStack_11a0;
                  fVar102 = fStack_119c;
                  fVar168 = local_10f8;
                  fVar198 = fStack_10f4;
                  fVar201 = fStack_10f0;
                  fVar205 = fStack_10ec;
                  if (iVar41 != 0) {
                    _local_1338 = auVar192;
                    local_1488 = fVar194 * fVar195 - local_1318 * fVar183;
                    fStack_1484 = fVar199 * fVar200 - fStack_1314 * fVar164;
                    fStack_1480 = fVar203 * fVar204 - fStack_1310 * fVar161;
                    fStack_147c = fVar207 * fVar208 - fStack_130c * fVar163;
                    auVar156._0_4_ = fVar183 * local_1328 - fVar195 * (float)local_1478[0];
                    auVar156._4_4_ = fVar164 * fStack_1324 - fVar200 * (float)auStack_1474[0];
                    auVar156._8_4_ = fVar161 * fStack_1320 - fVar204 * fStack_1470;
                    auVar156._12_4_ = fVar163 * fStack_131c - fVar208 * fStack_146c;
                    uVar40 = (uint)DAT_01f7b6c0;
                    uVar144 = DAT_01f7b6c0._4_4_;
                    uVar27 = DAT_01f7b6c0._8_4_;
                    uVar34 = DAT_01f7b6c0._12_4_;
                    auVar70._4_4_ =
                         -(uint)((float)((uint)(fStack_1314 * fVar164) & uVar144) <
                                (float)((uint)(fVar200 * (float)auStack_1474[0]) & uVar144));
                    auVar70._0_4_ =
                         -(uint)((float)((uint)(local_1318 * fVar183) & uVar40) <
                                (float)((uint)(fVar195 * (float)local_1478[0]) & uVar40));
                    auVar70._8_4_ =
                         -(uint)((float)((uint)(fStack_1310 * fVar161) & uVar27) <
                                (float)((uint)(fVar204 * fStack_1470) & uVar27));
                    auVar70._12_4_ =
                         -(uint)((float)((uint)(fStack_130c * fVar163) & uVar34) <
                                (float)((uint)(fVar208 * fStack_146c) & uVar34));
                    auVar25._4_4_ = fStack_1484;
                    auVar25._0_4_ = local_1488;
                    auVar25._8_4_ = fStack_1480;
                    auVar25._12_4_ = fStack_147c;
                    local_1278 = blendvps(auVar156,auVar25,auVar70);
                    auVar197._0_4_ = fVar195 * fVar136 - fVar166 * local_1328;
                    auVar197._4_4_ = fVar200 * fVar115 - fVar170 * fStack_1324;
                    auVar197._8_4_ = fVar204 * fStack_13e0 - fVar173 * fStack_1320;
                    auVar197._12_4_ = fVar208 * fStack_13dc - fVar176 * fStack_131c;
                    auVar71._4_4_ =
                         -(uint)((float)((uint)(fStack_1454 * fVar200) & uVar144) <
                                (float)((uint)(fVar170 * fStack_1324) & uVar144));
                    auVar71._0_4_ =
                         -(uint)((float)((uint)(local_1458 * fVar195) & uVar40) <
                                (float)((uint)(fVar166 * local_1328) & uVar40));
                    auVar71._8_4_ =
                         -(uint)((float)((uint)(fStack_1450 * fVar204) & uVar27) <
                                (float)((uint)(fVar173 * fStack_1320) & uVar27));
                    auVar71._12_4_ =
                         -(uint)((float)((uint)(fStack_144c * fVar208) & uVar34) <
                                (float)((uint)(fVar176 * fStack_131c) & uVar34));
                    auVar23._4_4_ = fStack_1314 * fVar170 - fStack_1454 * fVar200;
                    auVar23._0_4_ = local_1318 * fVar166 - local_1458 * fVar195;
                    auVar23._8_4_ = fStack_1310 * fVar173 - fStack_1450 * fVar204;
                    auVar23._12_4_ = fStack_130c * fVar176 - fStack_144c * fVar208;
                    local_1268 = blendvps(auVar197,auVar23,auVar71);
                    auVar178._0_4_ = local_1458 * fVar183 - fVar194 * fVar166;
                    auVar178._4_4_ = fStack_1454 * fVar164 - fVar199 * fVar170;
                    auVar178._8_4_ = fStack_1450 * fVar161 - fVar203 * fVar173;
                    auVar178._12_4_ = fStack_144c * fVar163 - fVar207 * fVar176;
                    auVar167._0_4_ = fVar166 * (float)local_1478[0] - fVar183 * fVar136;
                    auVar167._4_4_ = fVar170 * (float)auStack_1474[0] - fVar164 * fVar115;
                    auVar167._8_4_ = fVar173 * fStack_1470 - fVar161 * fStack_13e0;
                    auVar167._12_4_ = fVar176 * fStack_146c - fVar163 * fStack_13dc;
                    auVar72._4_4_ =
                         -(uint)((float)((uint)(fVar199 * fVar170) & uVar144) <
                                (float)((uint)(fVar164 * fVar115) & uVar144));
                    auVar72._0_4_ =
                         -(uint)((float)((uint)(fVar194 * fVar166) & uVar40) <
                                (float)((uint)(fVar183 * fVar136) & uVar40));
                    auVar72._8_4_ =
                         -(uint)((float)((uint)(fVar203 * fVar173) & uVar27) <
                                (float)((uint)(fVar161 * fStack_13e0) & uVar27));
                    auVar72._12_4_ =
                         -(uint)((float)((uint)(fVar207 * fVar176) & uVar34) <
                                (float)((uint)(fVar163 * fStack_13dc) & uVar34));
                    local_1258 = blendvps(auVar167,auVar178,auVar72);
                    fVar183 = local_1278._4_4_;
                    fVar164 = local_1278._8_4_;
                    fVar161 = local_1278._12_4_;
                    fVar136 = fStack_12fc * local_1278._0_4_ +
                              fVar82 * local_1268._0_4_ + (float)local_1498 * local_1258._0_4_;
                    fVar115 = fStack_12fc * fVar183 +
                              fVar100 * local_1268._4_4_ +
                              (float)auStack_1494._0_4_ * local_1258._4_4_;
                    fVar82 = fStack_12fc * fVar164 +
                             fVar172 * local_1268._8_4_ +
                             (float)auStack_1494._4_4_ * local_1258._8_4_;
                    fVar100 = fStack_12fc * fVar161 +
                              fVar175 * local_1268._12_4_ + fStack_148c * local_1258._12_4_;
                    auVar148._0_4_ = fVar136 + fVar136;
                    auVar148._4_4_ = fVar115 + fVar115;
                    auVar148._8_4_ = fVar82 + fVar82;
                    auVar148._12_4_ = fVar100 + fVar100;
                    auVar73._0_4_ = (float)local_13d8 * local_1258._0_4_;
                    auVar73._4_4_ = local_13d8._4_4_ * local_1258._4_4_;
                    auVar73._8_4_ = fStack_13d0 * local_1258._8_4_;
                    auVar73._12_4_ = fStack_13cc * local_1258._12_4_;
                    fVar172 = (float)local_13c8 * local_1278._0_4_ +
                              local_13b8 * local_1268._0_4_ + auVar73._0_4_;
                    fVar175 = local_13c8._4_4_ * fVar183 +
                              fStack_13b4 * local_1268._4_4_ + auVar73._4_4_;
                    fVar163 = fStack_13c0 * fVar164 + fStack_13b0 * local_1268._8_4_ + auVar73._8_4_
                    ;
                    fVar166 = fStack_13bc * fVar161 +
                              fStack_13ac * local_1268._12_4_ + auVar73._12_4_;
                    auVar50 = rcpps(auVar73,auVar148);
                    fVar136 = auVar50._0_4_;
                    fVar115 = auVar50._4_4_;
                    fVar82 = auVar50._8_4_;
                    fVar100 = auVar50._12_4_;
                    auVar113._0_4_ =
                         ((1.0 - auVar148._0_4_ * fVar136) * fVar136 + fVar136) *
                         (fVar172 + fVar172);
                    auVar113._4_4_ =
                         ((1.0 - auVar148._4_4_ * fVar115) * fVar115 + fVar115) *
                         (fVar175 + fVar175);
                    auVar113._8_4_ =
                         ((1.0 - auVar148._8_4_ * fVar82) * fVar82 + fVar82) * (fVar163 + fVar163);
                    auVar113._12_4_ =
                         ((1.0 - auVar148._12_4_ * fVar100) * fVar100 + fVar100) *
                         (fVar166 + fVar166);
                    local_14b8._0_4_ = (ray->super_RayK<1>).tfar;
                    local_14b8._4_4_ = (ray->super_RayK<1>).mask;
                    fStack_14b0 = (float)(ray->super_RayK<1>).id;
                    fStack_14ac = (float)(ray->super_RayK<1>).flags;
                    fVar136 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar149._0_4_ =
                         (int)((uint)(auVar148._0_4_ != 0.0 &&
                                     (auVar113._0_4_ <= (float)local_14b8._0_4_ &&
                                     fVar136 <= auVar113._0_4_)) * -0x80000000) >> 0x1f;
                    auVar149._4_4_ =
                         (int)((uint)(auVar148._4_4_ != 0.0 &&
                                     (auVar113._4_4_ <= (float)local_14b8._0_4_ &&
                                     fVar136 <= auVar113._4_4_)) * -0x80000000) >> 0x1f;
                    auVar149._8_4_ =
                         (int)((uint)(auVar148._8_4_ != 0.0 &&
                                     (auVar113._8_4_ <= (float)local_14b8._0_4_ &&
                                     fVar136 <= auVar113._8_4_)) * -0x80000000) >> 0x1f;
                    auVar149._12_4_ =
                         (int)((uint)(auVar148._12_4_ != 0.0 &&
                                     (auVar113._12_4_ <= (float)local_14b8._0_4_ &&
                                     fVar136 <= auVar113._12_4_)) * -0x80000000) >> 0x1f;
                    auVar150 = auVar149 & auVar93;
                    iVar41 = movmskps(iVar41,auVar150);
                    if (iVar41 != 0) {
                      uVar32 = extractps(_local_14b8,1);
                      local_12c8 = &local_14d1;
                      local_12b8 = auVar150;
                      local_1288 = auVar113;
                      auVar126._0_4_ = (float)local_12d8._0_4_ - auVar192._0_4_;
                      auVar126._4_4_ = (float)local_12d8._4_4_ - auVar192._4_4_;
                      auVar126._8_4_ = fStack_12d0 - auVar192._8_4_;
                      auVar126._12_4_ = fStack_12cc - auVar192._12_4_;
                      auVar94._4_12_ = auVar93._4_12_;
                      auVar94._0_4_ = (float)(int)(*(ushort *)(lVar30 + 8 + lVar44) - 1);
                      auVar151._4_4_ = auVar93._4_4_;
                      auVar151._0_4_ = auVar94._0_4_;
                      auVar151._8_4_ = auVar93._8_4_;
                      auVar151._12_4_ = auVar93._12_4_;
                      auVar50 = rcpss(auVar151,auVar94);
                      auVar157._4_12_ = local_1278._4_12_;
                      auVar157._0_4_ = (float)(int)(*(ushort *)(lVar30 + 10 + lVar44) - 1);
                      fStack_12ec = (2.0 - auVar94._0_4_ * auVar50._0_4_) * auVar50._0_4_;
                      auVar152._4_4_ = fVar183;
                      auVar152._0_4_ = auVar157._0_4_;
                      auVar152._8_4_ = fVar164;
                      auVar152._12_4_ = fVar161;
                      auVar50 = rcpss(auVar152,auVar157);
                      fVar136 = (2.0 - auVar157._0_4_ * auVar50._0_4_) * auVar50._0_4_;
                      local_12f8._0_4_ =
                           fStack_12ec *
                           ((float)(int)local_1118._0_4_ * (float)local_12d8._0_4_ +
                           ((float)local_12d8._0_4_ - fVar184));
                      local_12f8._4_4_ =
                           fStack_12ec *
                           ((float)(local_1118._0_4_ + 1) * (float)local_12d8._4_4_ +
                           ((float)local_12d8._4_4_ - fVar186));
                      fStack_12f0 = fStack_12ec *
                                    ((float)(local_1118._0_4_ + 1) * fStack_12d0 +
                                    (fStack_12d0 - fVar188));
                      fStack_12ec = fStack_12ec *
                                    ((float)(int)local_1118._0_4_ * fStack_12cc +
                                    (fStack_12cc - fVar190));
                      local_12e8._0_4_ =
                           fVar136 * ((float)(int)local_1128._0_4_ * (float)local_12d8._0_4_ +
                                     auVar126._0_4_);
                      local_12e8._4_4_ =
                           fVar136 * ((float)(int)local_1128._0_4_ * (float)local_12d8._4_4_ +
                                     auVar126._4_4_);
                      fStack_12e0 = fVar136 * ((float)(local_1128._0_4_ + 1) * fStack_12d0 +
                                              auVar126._8_4_);
                      fStack_12dc = fVar136 * ((float)(local_1128._0_4_ + 1) * fStack_12cc +
                                              auVar126._12_4_);
                      pGVar11 = (local_14d0->scene->geometries).items[local_14c4._4_8_].ptr;
                      if ((pGVar11->mask & (uint)uVar32) != 0) {
                        local_1448 = auVar150;
                        auVar22._4_4_ = local_12d8._4_4_;
                        auVar22._0_4_ = local_12d8._0_4_;
                        auVar22._8_4_ = fStack_12d0;
                        auVar22._12_4_ = fStack_12cc;
                        auVar50 = rcpps(auVar126,auVar22);
                        fVar136 = auVar50._0_4_;
                        fVar115 = auVar50._4_4_;
                        fVar82 = auVar50._8_4_;
                        fVar100 = auVar50._12_4_;
                        local_1348._4_4_ = (undefined4)((ulong)local_1348 >> 0x20);
                        fVar136 = (float)(-(uint)(1e-18 <= (float)local_1348._0_4_) &
                                         (uint)(((float)DAT_01f7ba10 -
                                                (float)local_12d8._0_4_ * fVar136) * fVar136 +
                                               fVar136));
                        fVar115 = (float)(-(uint)(1e-18 <= (float)local_1348._4_4_) &
                                         (uint)((DAT_01f7ba10._4_4_ -
                                                (float)local_12d8._4_4_ * fVar115) * fVar115 +
                                               fVar115));
                        fVar82 = (float)(-(uint)(1e-18 <= fStack_1340) &
                                        (uint)((DAT_01f7ba10._8_4_ - fStack_12d0 * fVar82) * fVar82
                                              + fVar82));
                        fVar100 = (float)(-(uint)(1e-18 <= fStack_133c) &
                                         (uint)((DAT_01f7ba10._12_4_ - fStack_12cc * fVar100) *
                                                fVar100 + fVar100));
                        auVar179._0_4_ = (float)local_12f8._0_4_ * fVar136;
                        auVar179._4_4_ = (float)local_12f8._4_4_ * fVar115;
                        auVar179._8_4_ = fStack_12f0 * fVar82;
                        auVar179._12_4_ = fStack_12ec * fVar100;
                        local_12a8 = minps(auVar179,_DAT_01f7ba10);
                        auVar95._0_4_ = (float)local_12e8._0_4_ * fVar136;
                        auVar95._4_4_ = (float)local_12e8._4_4_ * fVar115;
                        auVar95._8_4_ = fStack_12e0 * fVar82;
                        auVar95._12_4_ = fStack_12dc * fVar100;
                        local_1298 = minps(auVar95,_DAT_01f7ba10);
                        auVar50 = blendvps(_DAT_01f7a9f0,auVar113,auVar150);
                        auVar114._4_4_ = auVar50._0_4_;
                        auVar114._0_4_ = auVar50._4_4_;
                        auVar114._8_4_ = auVar50._12_4_;
                        auVar114._12_4_ = auVar50._8_4_;
                        auVar83 = minps(auVar114,auVar50);
                        auVar127._0_8_ = auVar83._8_8_;
                        auVar127._8_4_ = auVar83._0_4_;
                        auVar127._12_4_ = auVar83._4_4_;
                        auVar83 = minps(auVar127,auVar83);
                        auVar128._0_8_ =
                             CONCAT44(-(uint)(auVar83._4_4_ == auVar50._4_4_) & auVar150._4_4_,
                                      -(uint)(auVar83._0_4_ == auVar50._0_4_) & auVar150._0_4_);
                        auVar128._8_4_ = -(uint)(auVar83._8_4_ == auVar50._8_4_) & auVar150._8_4_;
                        auVar128._12_4_ =
                             -(uint)(auVar83._12_4_ == auVar50._12_4_) & auVar150._12_4_;
                        iVar41 = movmskps((uint)uVar32,auVar128);
                        if (iVar41 != 0) {
                          auVar150._8_4_ = auVar128._8_4_;
                          auVar150._0_8_ = auVar128._0_8_;
                          auVar150._12_4_ = auVar128._12_4_;
                        }
                        uVar28 = movmskps(iVar41,auVar150);
                        uVar39 = CONCAT44((int)((ulong)uVar32 >> 0x20),uVar28);
                        lVar30 = 0;
                        if (uVar39 != 0) {
                          for (; (uVar39 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                          }
                        }
                        pRVar13 = local_14d0->args;
                        if (pRVar13->filter == (RTCFilterFunctionN)0x0) {
                          pRVar47 = local_14d0->user;
                          if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                            fVar136 = *(float *)(local_12a8 + lVar30 * 4);
                            fVar115 = *(float *)(local_1298 + lVar30 * 4);
                            fVar82 = *(float *)(local_1278 + lVar30 * 4);
                            fVar100 = *(float *)(local_1268 + lVar30 * 4);
                            fVar172 = *(float *)(local_1258 + lVar30 * 4);
                            (ray->super_RayK<1>).tfar = *(float *)(local_1288 + lVar30 * 4);
                            (ray->Ng).field_0.field_0.x = fVar82;
                            (ray->Ng).field_0.field_0.y = fVar100;
                            (ray->Ng).field_0.field_0.z = fVar172;
                            ray->u = fVar136;
                            ray->v = fVar115;
                            ray->primID = (uint)local_1460;
                            ray->geomID = (uint)local_14c4._4_8_;
                            ray->instID[0] = pRVar47->instID[0];
                            ray->instPrimID[0] = pRVar47->instPrimID[0];
                            uVar39 = local_1430;
                            goto LAB_00db3ee5;
                          }
                        }
                        else {
                          pRVar47 = local_14d0->user;
                        }
                        _local_1498 = auVar113;
                        _local_1348 = auVar155;
                        local_1308 = fStack_12fc;
                        fStack_1304 = fStack_12fc;
                        fStack_1300 = fStack_12fc;
                        while( true ) {
                          local_139c = *(undefined4 *)(local_12a8 + lVar30 * 4);
                          local_1398 = *(undefined4 *)(local_1298 + lVar30 * 4);
                          (ray->super_RayK<1>).tfar = *(float *)(local_1288 + lVar30 * 4);
                          local_13a8 = *(float *)(local_1278 + lVar30 * 4);
                          local_13a4 = *(undefined4 *)(local_1268 + lVar30 * 4);
                          local_13a0 = *(undefined4 *)(local_1258 + lVar30 * 4);
                          local_1394 = (int)local_1460;
                          local_1390 = (int)local_14c4._4_8_;
                          local_138c = pRVar47->instID[0];
                          local_1388 = pRVar47->instPrimID[0];
                          local_14c4._0_4_ = -NAN;
                          local_1428.valid = (int *)local_14c4;
                          local_1428.geometryUserPtr = pGVar11->userPtr;
                          local_1428.context = pRVar47;
                          local_1428.ray = (RTCRayN *)ray;
                          local_1428.hit = (RTCHitN *)&local_13a8;
                          local_1428.N = 1;
                          if (((pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                              ((*pGVar11->intersectionFilterN)(&local_1428), auVar113 = _local_1498,
                              (((RayK<1> *)local_1428.valid)->org).field_0.m128[0] != 0.0)) &&
                             (((pRVar13->filter == (RTCFilterFunctionN)0x0 ||
                               (((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                                 RTC_RAY_QUERY_FLAG_INCOHERENT &&
                                (((pGVar11->field_8).field_0x2 & 0x40) == 0)))) ||
                              ((*pRVar13->filter)(&local_1428), auVar113 = _local_1498,
                              (((RayK<1> *)local_1428.valid)->org).field_0.m128[0] != 0.0)))) {
                            (((Vec3f *)((long)local_1428.ray + 0x30))->field_0).field_0.x =
                                 *(float *)local_1428.hit;
                            (((Vec3f *)((long)local_1428.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_1428.hit + 4);
                            (((Vec3f *)((long)local_1428.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_1428.hit + 8);
                            *(float *)((long)local_1428.ray + 0x3c) =
                                 *(float *)(local_1428.hit + 0xc);
                            *(float *)((long)local_1428.ray + 0x40) =
                                 *(float *)(local_1428.hit + 0x10);
                            *(float *)((long)local_1428.ray + 0x44) =
                                 *(float *)(local_1428.hit + 0x14);
                            *(float *)((long)local_1428.ray + 0x48) =
                                 *(float *)(local_1428.hit + 0x18);
                            *(float *)((long)local_1428.ray + 0x4c) =
                                 *(float *)(local_1428.hit + 0x1c);
                            *(float *)((long)local_1428.ray + 0x50) =
                                 *(float *)(local_1428.hit + 0x20);
                            pRVar33 = (RayHit *)local_1428.ray;
                          }
                          else {
                            (ray->super_RayK<1>).tfar = (float)local_14b8._0_4_;
                            pRVar33 = (RayHit *)local_1428.valid;
                            auVar113 = _local_1498;
                          }
                          *(undefined4 *)(local_1448 + lVar30 * 4) = 0;
                          local_14b8._0_4_ = (ray->super_RayK<1>).tfar;
                          local_14b8._4_4_ = (ray->super_RayK<1>).mask;
                          fStack_14b0 = (float)(ray->super_RayK<1>).id;
                          fStack_14ac = (float)(ray->super_RayK<1>).flags;
                          auVar75._0_4_ =
                               -(uint)(auVar113._0_4_ <= (float)local_14b8._0_4_) & local_1448._0_4_
                          ;
                          auVar75._4_4_ =
                               -(uint)(auVar113._4_4_ <= (float)local_14b8._0_4_) & local_1448._4_4_
                          ;
                          auVar75._8_4_ =
                               -(uint)(auVar113._8_4_ <= (float)local_14b8._0_4_) & local_1448._8_4_
                          ;
                          auVar75._12_4_ =
                               -(uint)(auVar113._12_4_ <= (float)local_14b8._0_4_) &
                               local_1448._12_4_;
                          local_1448 = auVar75;
                          iVar41 = movmskps((int)pRVar33,auVar75);
                          context = local_14d0;
                          uVar37 = local_11f0;
                          uVar39 = local_1430;
                          uVar42 = local_11e8;
                          uVar43 = local_11f8;
                          uVar46 = local_14a0;
                          auVar125 = local_1058;
                          fVar185 = local_10e8;
                          fVar162 = fStack_10e4;
                          fVar135 = fStack_10e0;
                          fVar143 = fStack_10dc;
                          fVar153 = local_1108;
                          fVar145 = fStack_1104;
                          fVar165 = fStack_1100;
                          fVar169 = fStack_10fc;
                          fVar159 = local_10b8;
                          fVar187 = fStack_10b4;
                          fVar189 = fStack_10b0;
                          fVar193 = fStack_10ac;
                          fVar171 = local_10c8;
                          fVar202 = fStack_10c4;
                          fVar206 = fStack_10c0;
                          fVar174 = fStack_10bc;
                          fVar154 = local_10d8;
                          fVar180 = fStack_10d4;
                          fVar181 = fStack_10d0;
                          fVar182 = fStack_10cc;
                          fVar158 = local_11a8;
                          fVar101 = fStack_11a4;
                          fVar160 = fStack_11a0;
                          fVar102 = fStack_119c;
                          fVar168 = local_10f8;
                          fVar198 = fStack_10f4;
                          fVar201 = fStack_10f0;
                          fVar205 = fStack_10ec;
                          if (iVar41 == 0) break;
                          auVar125 = blendvps(_DAT_01f7a9f0,auVar113,auVar75);
                          auVar130._4_4_ = auVar125._0_4_;
                          auVar130._0_4_ = auVar125._4_4_;
                          auVar130._8_4_ = auVar125._12_4_;
                          auVar130._12_4_ = auVar125._8_4_;
                          auVar155 = minps(auVar130,auVar125);
                          auVar98._0_8_ = auVar155._8_8_;
                          auVar98._8_4_ = auVar155._0_4_;
                          auVar98._12_4_ = auVar155._4_4_;
                          auVar155 = minps(auVar98,auVar155);
                          auVar99._0_8_ =
                               CONCAT44(-(uint)(auVar155._4_4_ == auVar125._4_4_) & auVar75._4_4_,
                                        -(uint)(auVar155._0_4_ == auVar125._0_4_) & auVar75._0_4_);
                          auVar99._8_4_ = -(uint)(auVar155._8_4_ == auVar125._8_4_) & auVar75._8_4_;
                          auVar99._12_4_ =
                               -(uint)(auVar155._12_4_ == auVar125._12_4_) & auVar75._12_4_;
                          iVar41 = movmskps(iVar41,auVar99);
                          if (iVar41 != 0) {
                            auVar75._8_4_ = auVar99._8_4_;
                            auVar75._0_8_ = auVar99._0_8_;
                            auVar75._12_4_ = auVar99._12_4_;
                          }
                          uVar28 = movmskps(iVar41,auVar75);
                          uVar37 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar28);
                          lVar30 = 0;
                          if (uVar37 != 0) {
                            for (; (uVar37 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                            }
                          }
                        }
                      }
                    }
                  }
                }
LAB_00db3ee5:
                local_11d8 = local_11d8 & local_11d8 - 1;
              } while (local_11d8 != 0);
            }
            local_1200 = local_1200 + 1;
          } while (local_1200 != local_1208);
        }
        fVar136 = (ray->super_RayK<1>).tfar;
        auVar125._4_4_ = fVar136;
        auVar125._0_4_ = fVar136;
        auVar125._8_4_ = fVar136;
        auVar125._12_4_ = fVar136;
        auVar155 = local_11b8;
        fVar115 = local_1248;
        fVar136 = fStack_1244;
        fVar82 = fStack_1240;
        fVar100 = fStack_123c;
        fVar164 = local_11c8;
        fVar172 = fStack_11c4;
        fVar175 = fStack_11c0;
        fVar183 = fStack_11bc;
      }
    } while (local_1370 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }